

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  ulong uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  byte bVar85;
  ulong uVar86;
  uint uVar87;
  long lVar88;
  undefined1 auVar96 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  Geometry *pGVar89;
  long lVar90;
  undefined8 unaff_R13;
  ulong uVar91;
  ulong uVar92;
  uint uVar93;
  byte bVar94;
  float fVar95;
  float fVar146;
  float fVar148;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar103 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar152;
  float fVar153;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar192;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  RTCFilterFunctionNArguments args;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  
  uVar86 = (ulong)(byte)prim[1];
  fVar171 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar100 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar186 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  fVar176 = fVar171 * auVar186._0_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar86 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar96);
  fVar154 = fVar171 * auVar100._0_4_;
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar86 * 5 + 6);
  auVar107 = vpmovsxbd_avx2(auVar101);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar86 * 6 + 6);
  auVar120 = vpmovsxbd_avx2(auVar102);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar119 = vpmovsxbd_avx2(auVar156);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar86 * 0xc + 6);
  auVar110 = vpmovsxbd_avx2(auVar8);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar108 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar118 = vpmovsxbd_avx2(auVar10);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar86 * 0x13 + 6);
  auVar111 = vpmovsxbd_avx2(auVar11);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar86 * 0x14 + 6);
  auVar113 = vpmovsxbd_avx2(auVar12);
  auVar112 = vcvtdq2ps_avx(auVar113);
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar225._4_4_ = fVar154;
  auVar225._0_4_ = fVar154;
  auVar225._8_4_ = fVar154;
  auVar225._12_4_ = fVar154;
  auVar225._16_4_ = fVar154;
  auVar225._20_4_ = fVar154;
  auVar225._24_4_ = fVar154;
  auVar225._28_4_ = fVar154;
  auVar106 = ZEXT1632(CONCAT412(fVar171 * auVar100._12_4_,
                                CONCAT48(fVar171 * auVar100._8_4_,
                                         CONCAT44(fVar171 * auVar100._4_4_,fVar154))));
  auVar114 = vpermps_avx2(auVar227,auVar106);
  auVar104 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = vpermps_avx512vl(auVar104,auVar106);
  fVar154 = auVar105._0_4_;
  auVar232._0_4_ = fVar154 * auVar120._0_4_;
  fVar166 = auVar105._4_4_;
  auVar232._4_4_ = fVar166 * auVar120._4_4_;
  fVar167 = auVar105._8_4_;
  auVar232._8_4_ = fVar167 * auVar120._8_4_;
  fVar178 = auVar105._12_4_;
  auVar232._12_4_ = fVar178 * auVar120._12_4_;
  fVar177 = auVar105._16_4_;
  auVar232._16_4_ = fVar177 * auVar120._16_4_;
  fVar192 = auVar105._20_4_;
  auVar232._20_4_ = fVar192 * auVar120._20_4_;
  fVar95 = auVar105._24_4_;
  auVar232._28_36_ = in_ZMM4._28_36_;
  auVar232._24_4_ = fVar95 * auVar120._24_4_;
  auVar106._4_4_ = auVar108._4_4_ * fVar166;
  auVar106._0_4_ = auVar108._0_4_ * fVar154;
  auVar106._8_4_ = auVar108._8_4_ * fVar167;
  auVar106._12_4_ = auVar108._12_4_ * fVar178;
  auVar106._16_4_ = auVar108._16_4_ * fVar177;
  auVar106._20_4_ = auVar108._20_4_ * fVar192;
  auVar106._24_4_ = auVar108._24_4_ * fVar95;
  auVar106._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = fVar166 * auVar112._4_4_;
  auVar113._0_4_ = fVar154 * auVar112._0_4_;
  auVar113._8_4_ = fVar167 * auVar112._8_4_;
  auVar113._12_4_ = fVar178 * auVar112._12_4_;
  auVar113._16_4_ = fVar177 * auVar112._16_4_;
  auVar113._20_4_ = fVar192 * auVar112._20_4_;
  auVar113._24_4_ = fVar95 * auVar112._24_4_;
  auVar113._28_4_ = auVar105._28_4_;
  auVar96 = vfmadd231ps_fma(auVar232._0_32_,auVar114,auVar107);
  auVar101 = vfmadd231ps_fma(auVar106,auVar114,auVar110);
  auVar102 = vfmadd231ps_fma(auVar113,auVar111,auVar114);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar225,auVar109);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar225,auVar119);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar118,auVar225);
  auVar226._4_4_ = fVar176;
  auVar226._0_4_ = fVar176;
  auVar226._8_4_ = fVar176;
  auVar226._12_4_ = fVar176;
  auVar226._16_4_ = fVar176;
  auVar226._20_4_ = fVar176;
  auVar226._24_4_ = fVar176;
  auVar226._28_4_ = fVar176;
  auVar114 = ZEXT1632(CONCAT412(fVar171 * auVar186._12_4_,
                                CONCAT48(fVar171 * auVar186._8_4_,
                                         CONCAT44(fVar171 * auVar186._4_4_,fVar176))));
  auVar113 = vpermps_avx2(auVar227,auVar114);
  auVar106 = vpermps_avx512vl(auVar104,auVar114);
  fVar171 = auVar106._0_4_;
  fVar154 = auVar106._4_4_;
  auVar114._4_4_ = fVar154 * auVar120._4_4_;
  auVar114._0_4_ = fVar171 * auVar120._0_4_;
  fVar166 = auVar106._8_4_;
  auVar114._8_4_ = fVar166 * auVar120._8_4_;
  fVar167 = auVar106._12_4_;
  auVar114._12_4_ = fVar167 * auVar120._12_4_;
  fVar178 = auVar106._16_4_;
  auVar114._16_4_ = fVar178 * auVar120._16_4_;
  fVar177 = auVar106._20_4_;
  auVar114._20_4_ = fVar177 * auVar120._20_4_;
  fVar192 = auVar106._24_4_;
  auVar114._24_4_ = fVar192 * auVar120._24_4_;
  auVar114._28_4_ = auVar120._28_4_;
  auVar117._0_4_ = fVar171 * auVar108._0_4_;
  auVar117._4_4_ = fVar154 * auVar108._4_4_;
  auVar117._8_4_ = fVar166 * auVar108._8_4_;
  auVar117._12_4_ = fVar167 * auVar108._12_4_;
  auVar117._16_4_ = fVar178 * auVar108._16_4_;
  auVar117._20_4_ = fVar177 * auVar108._20_4_;
  auVar117._24_4_ = fVar192 * auVar108._24_4_;
  auVar117._28_4_ = 0;
  auVar108._4_4_ = fVar154 * auVar112._4_4_;
  auVar108._0_4_ = fVar171 * auVar112._0_4_;
  auVar108._8_4_ = fVar166 * auVar112._8_4_;
  auVar108._12_4_ = fVar167 * auVar112._12_4_;
  auVar108._16_4_ = fVar178 * auVar112._16_4_;
  auVar108._20_4_ = fVar177 * auVar112._20_4_;
  auVar108._24_4_ = fVar192 * auVar112._24_4_;
  auVar108._28_4_ = auVar112._28_4_;
  auVar156 = vfmadd231ps_fma(auVar114,auVar113,auVar107);
  auVar8 = vfmadd231ps_fma(auVar117,auVar113,auVar110);
  auVar9 = vfmadd231ps_fma(auVar108,auVar113,auVar111);
  auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar226,auVar109);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar226,auVar119);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar226,auVar118);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar216._16_4_ = 0x7fffffff;
  auVar216._20_4_ = 0x7fffffff;
  auVar216._24_4_ = 0x7fffffff;
  auVar216._28_4_ = 0x7fffffff;
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar208._16_4_ = 0x219392ef;
  auVar208._20_4_ = 0x219392ef;
  auVar208._24_4_ = 0x219392ef;
  auVar208._28_4_ = 0x219392ef;
  auVar109 = vandps_avx(auVar216,ZEXT1632(auVar96));
  uVar91 = vcmpps_avx512vl(auVar109,auVar208,1);
  bVar18 = (bool)((byte)uVar91 & 1);
  auVar104._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._0_4_;
  bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._4_4_;
  bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._8_4_;
  bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(auVar216,ZEXT1632(auVar101));
  uVar91 = vcmpps_avx512vl(auVar109,auVar208,1);
  bVar18 = (bool)((byte)uVar91 & 1);
  auVar105._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._0_4_;
  bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._4_4_;
  bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._8_4_;
  bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(auVar216,ZEXT1632(auVar102));
  uVar91 = vcmpps_avx512vl(auVar109,auVar208,1);
  bVar18 = (bool)((byte)uVar91 & 1);
  auVar109._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar102._0_4_;
  bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar102._4_4_;
  bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar102._8_4_;
  bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar102._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar107 = vrcp14ps_avx512vl(auVar104);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = 0x3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar212._16_4_ = 0x3f800000;
  auVar212._20_4_ = 0x3f800000;
  auVar212._24_4_ = 0x3f800000;
  auVar212._28_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar104,auVar107,auVar212);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar105);
  auVar101 = vfnmadd213ps_fma(auVar105,auVar107,auVar212);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar109);
  auVar102 = vfnmadd213ps_fma(auVar109,auVar107,auVar212);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar107,auVar107);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 7 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar156));
  auVar118._4_4_ = auVar96._4_4_ * auVar109._4_4_;
  auVar118._0_4_ = auVar96._0_4_ * auVar109._0_4_;
  auVar118._8_4_ = auVar96._8_4_ * auVar109._8_4_;
  auVar118._12_4_ = auVar96._12_4_ * auVar109._12_4_;
  auVar118._16_4_ = auVar109._16_4_ * 0.0;
  auVar118._20_4_ = auVar109._20_4_ * 0.0;
  auVar118._24_4_ = auVar109._24_4_ * 0.0;
  auVar118._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 9 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar156));
  auVar193._0_4_ = auVar96._0_4_ * auVar109._0_4_;
  auVar193._4_4_ = auVar96._4_4_ * auVar109._4_4_;
  auVar193._8_4_ = auVar96._8_4_ * auVar109._8_4_;
  auVar193._12_4_ = auVar96._12_4_ * auVar109._12_4_;
  auVar193._16_4_ = auVar109._16_4_ * 0.0;
  auVar193._20_4_ = auVar109._20_4_ * 0.0;
  auVar193._24_4_ = auVar109._24_4_ * 0.0;
  auVar193._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0xe + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar8));
  auVar111._4_4_ = auVar101._4_4_ * auVar109._4_4_;
  auVar111._0_4_ = auVar101._0_4_ * auVar109._0_4_;
  auVar111._8_4_ = auVar101._8_4_ * auVar109._8_4_;
  auVar111._12_4_ = auVar101._12_4_ * auVar109._12_4_;
  auVar111._16_4_ = auVar109._16_4_ * 0.0;
  auVar111._20_4_ = auVar109._20_4_ * 0.0;
  auVar111._24_4_ = auVar109._24_4_ * 0.0;
  auVar111._28_4_ = auVar109._28_4_;
  auVar108 = vpbroadcastd_avx512vl();
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar8));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x15 + 6));
  auVar116._0_4_ = auVar101._0_4_ * auVar109._0_4_;
  auVar116._4_4_ = auVar101._4_4_ * auVar109._4_4_;
  auVar116._8_4_ = auVar101._8_4_ * auVar109._8_4_;
  auVar116._12_4_ = auVar101._12_4_ * auVar109._12_4_;
  auVar116._16_4_ = auVar109._16_4_ * 0.0;
  auVar116._20_4_ = auVar109._20_4_ * 0.0;
  auVar116._24_4_ = auVar109._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar109 = vcvtdq2ps_avx(auVar107);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar9));
  auVar112._4_4_ = auVar109._4_4_ * auVar102._4_4_;
  auVar112._0_4_ = auVar109._0_4_ * auVar102._0_4_;
  auVar112._8_4_ = auVar109._8_4_ * auVar102._8_4_;
  auVar112._12_4_ = auVar109._12_4_ * auVar102._12_4_;
  auVar112._16_4_ = auVar109._16_4_ * 0.0;
  auVar112._20_4_ = auVar109._20_4_ * 0.0;
  auVar112._24_4_ = auVar109._24_4_ * 0.0;
  auVar112._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x17 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar9));
  auVar115._0_4_ = auVar102._0_4_ * auVar109._0_4_;
  auVar115._4_4_ = auVar102._4_4_ * auVar109._4_4_;
  auVar115._8_4_ = auVar102._8_4_ * auVar109._8_4_;
  auVar115._12_4_ = auVar102._12_4_ * auVar109._12_4_;
  auVar115._16_4_ = auVar109._16_4_ * 0.0;
  auVar115._20_4_ = auVar109._20_4_ * 0.0;
  auVar115._24_4_ = auVar109._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar109 = vpminsd_avx2(auVar118,auVar193);
  auVar107 = vpminsd_avx2(auVar111,auVar116);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107 = vpminsd_avx2(auVar112,auVar115);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar120._4_4_ = uVar155;
  auVar120._0_4_ = uVar155;
  auVar120._8_4_ = uVar155;
  auVar120._12_4_ = uVar155;
  auVar120._16_4_ = uVar155;
  auVar120._20_4_ = uVar155;
  auVar120._24_4_ = uVar155;
  auVar120._28_4_ = uVar155;
  auVar107 = vmaxps_avx512vl(auVar107,auVar120);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  auVar107._16_4_ = 0x3f7ffffa;
  auVar107._20_4_ = 0x3f7ffffa;
  auVar107._24_4_ = 0x3f7ffffa;
  auVar107._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar109,auVar107);
  auVar109 = vpmaxsd_avx2(auVar118,auVar193);
  auVar107 = vpmaxsd_avx2(auVar111,auVar116);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar107 = vpmaxsd_avx2(auVar112,auVar115);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar119._4_4_ = uVar155;
  auVar119._0_4_ = uVar155;
  auVar119._8_4_ = uVar155;
  auVar119._12_4_ = uVar155;
  auVar119._16_4_ = uVar155;
  auVar119._20_4_ = uVar155;
  auVar119._24_4_ = uVar155;
  auVar119._28_4_ = uVar155;
  auVar107 = vminps_avx512vl(auVar107,auVar119);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar110._8_4_ = 0x3f800003;
  auVar110._0_8_ = 0x3f8000033f800003;
  auVar110._12_4_ = 0x3f800003;
  auVar110._16_4_ = 0x3f800003;
  auVar110._20_4_ = 0x3f800003;
  auVar110._24_4_ = 0x3f800003;
  auVar110._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar110);
  uVar25 = vcmpps_avx512vl(local_80,auVar109,2);
  uVar29 = vpcmpgtd_avx512vl(auVar108,_DAT_01fb4ba0);
  uVar91 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar25 & (byte)uVar29));
  local_5e8 = pre->ray_space + k;
  local_628 = (undefined1 (*) [32])&local_180;
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar96);
  local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  do {
    if (uVar91 == 0) {
      return;
    }
    lVar90 = 0;
    for (uVar86 = uVar91; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
      lVar90 = lVar90 + 1;
    }
    uVar13 = *(uint *)(prim + 2);
    uVar14 = *(uint *)(prim + lVar90 * 4 + 6);
    pGVar89 = (context->scene->geometries).items[uVar13].ptr;
    uVar86 = (ulong)*(uint *)(*(long *)&pGVar89->field_0x58 +
                             pGVar89[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar14);
    p_Var17 = pGVar89[1].intersectionFilterN;
    lVar90 = *(long *)&pGVar89[1].time_range.upper;
    auVar96 = *(undefined1 (*) [16])(lVar90 + (long)p_Var17 * uVar86);
    pauVar3 = (undefined1 (*) [16])(lVar90 + (uVar86 + 1) * (long)p_Var17);
    uVar25 = *(undefined8 *)*pauVar3;
    uVar29 = *(undefined8 *)(*pauVar3 + 8);
    auVar12 = *pauVar3;
    auVar10 = *pauVar3;
    auVar8 = *pauVar3;
    auVar101 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar90 + (uVar86 + 2) * (long)p_Var17);
    uVar79 = *(undefined8 *)*pauVar4;
    uVar80 = *(undefined8 *)(*pauVar4 + 8);
    auVar11 = *pauVar4;
    auVar9 = *pauVar4;
    auVar156 = *pauVar4;
    auVar102 = *pauVar4;
    uVar91 = uVar91 - 1 & uVar91;
    pauVar5 = (undefined1 (*) [12])(lVar90 + (uVar86 + 3) * (long)p_Var17);
    uVar81 = *(undefined8 *)*pauVar5;
    uVar82 = *(undefined8 *)(*pauVar5 + 8);
    local_6d0 = (float)uVar81;
    fStack_6cc = (float)((ulong)uVar81 >> 0x20);
    fStack_6c8 = (float)uVar82;
    fStack_6c4 = (float)((ulong)uVar82 >> 0x20);
    if (uVar91 != 0) {
      uVar92 = uVar91 - 1 & uVar91;
      for (uVar86 = uVar91; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
      }
      if (uVar92 != 0) {
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar15 = (int)pGVar89[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar100 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar169 = vsubps_avx(auVar96,auVar100);
    uVar155 = auVar169._0_4_;
    auVar99._4_4_ = uVar155;
    auVar99._0_4_ = uVar155;
    auVar99._8_4_ = uVar155;
    auVar99._12_4_ = uVar155;
    auVar186 = vshufps_avx(auVar169,auVar169,0x55);
    aVar6 = (local_5e8->vx).field_0;
    aVar7 = (local_5e8->vy).field_0;
    auVar169 = vshufps_avx(auVar169,auVar169,0xaa);
    fVar171 = (local_5e8->vz).field_0.m128[0];
    fVar154 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
    fVar166 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
    fVar167 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
    auVar215._0_4_ = fVar171 * auVar169._0_4_;
    auVar215._4_4_ = fVar154 * auVar169._4_4_;
    auVar215._8_4_ = fVar166 * auVar169._8_4_;
    auVar215._12_4_ = fVar167 * auVar169._12_4_;
    auVar186 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar186);
    auVar215 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar99);
    auVar186 = vshufps_avx(auVar96,auVar96,0xff);
    auVar99 = vsubps_avx(auVar101,auVar100);
    uVar155 = auVar99._0_4_;
    auVar97._4_4_ = uVar155;
    auVar97._0_4_ = uVar155;
    auVar97._8_4_ = uVar155;
    auVar97._12_4_ = uVar155;
    auVar169 = vshufps_avx(auVar99,auVar99,0x55);
    auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar217._0_4_ = fVar171 * auVar99._0_4_;
    auVar217._4_4_ = fVar154 * auVar99._4_4_;
    auVar217._8_4_ = fVar166 * auVar99._8_4_;
    auVar217._12_4_ = fVar167 * auVar99._12_4_;
    auVar169 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar7,auVar169);
    auVar217 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar6,auVar97);
    auVar169 = vshufps_avx(auVar101,auVar101,0xff);
    auVar97 = vsubps_avx512vl(auVar102,auVar100);
    uVar155 = auVar97._0_4_;
    auVar98._4_4_ = uVar155;
    auVar98._0_4_ = uVar155;
    auVar98._8_4_ = uVar155;
    auVar98._12_4_ = uVar155;
    auVar99 = vshufps_avx(auVar97,auVar97,0x55);
    auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
    auVar220._0_4_ = fVar171 * auVar97._0_4_;
    auVar220._4_4_ = fVar154 * auVar97._4_4_;
    auVar220._8_4_ = fVar166 * auVar97._8_4_;
    auVar220._12_4_ = fVar167 * auVar97._12_4_;
    auVar99 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar7,auVar99);
    auVar97 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar6,auVar98);
    auVar98 = vshufps_avx512vl(auVar102,auVar102,0xff);
    auVar30._12_4_ = fStack_6c4;
    auVar30._0_12_ = *pauVar5;
    auVar99 = vsubps_avx512vl(auVar30,auVar100);
    uVar155 = auVar99._0_4_;
    auVar179._4_4_ = uVar155;
    auVar179._0_4_ = uVar155;
    auVar179._8_4_ = uVar155;
    auVar179._12_4_ = uVar155;
    auVar100 = vshufps_avx(auVar99,auVar99,0x55);
    auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar224._0_4_ = fVar171 * auVar99._0_4_;
    auVar224._4_4_ = fVar154 * auVar99._4_4_;
    auVar224._8_4_ = fVar166 * auVar99._8_4_;
    auVar224._12_4_ = fVar167 * auVar99._12_4_;
    auVar100 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar7,auVar100);
    auVar99 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar6,auVar179);
    auVar100 = vshufps_avx512vl(auVar30,auVar30,0xff);
    lVar90 = (long)iVar15 * 0x44;
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90);
    uVar155 = auVar215._0_4_;
    local_420._4_4_ = uVar155;
    local_420._0_4_ = uVar155;
    local_420._8_4_ = uVar155;
    local_420._12_4_ = uVar155;
    local_420._16_4_ = uVar155;
    local_420._20_4_ = uVar155;
    local_420._24_4_ = uVar155;
    local_420._28_4_ = uVar155;
    auVar194._8_4_ = 1;
    auVar194._0_8_ = 0x100000001;
    auVar194._12_4_ = 1;
    auVar194._16_4_ = 1;
    auVar194._20_4_ = 1;
    auVar194._24_4_ = 1;
    auVar194._28_4_ = 1;
    local_440 = vpermps_avx2(auVar194,ZEXT1632(auVar215));
    local_a0 = vbroadcastsd_avx512vl(auVar186);
    auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0x484);
    uVar155 = auVar217._0_4_;
    auVar103._4_4_ = uVar155;
    auVar103._0_4_ = uVar155;
    auVar103._8_4_ = uVar155;
    auVar103._12_4_ = uVar155;
    local_460._16_4_ = uVar155;
    local_460._0_16_ = auVar103;
    local_460._20_4_ = uVar155;
    local_460._24_4_ = uVar155;
    local_460._28_4_ = uVar155;
    local_480 = vpermps_avx512vl(auVar194,ZEXT1632(auVar217));
    local_c0 = vbroadcastsd_avx512vl(auVar169);
    auVar120 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0x908);
    uVar155 = auVar97._0_4_;
    local_4a0._4_4_ = uVar155;
    local_4a0._0_4_ = uVar155;
    local_4a0._8_4_ = uVar155;
    local_4a0._12_4_ = uVar155;
    local_4a0._16_4_ = uVar155;
    local_4a0._20_4_ = uVar155;
    local_4a0._24_4_ = uVar155;
    local_4a0._28_4_ = uVar155;
    local_4c0 = vpermps_avx512vl(auVar194,ZEXT1632(auVar97));
    local_e0 = vbroadcastsd_avx512vl(auVar98);
    auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0xd8c);
    fVar154 = auVar99._0_4_;
    local_4e0._4_4_ = fVar154;
    local_4e0._0_4_ = fVar154;
    fStack_4d8 = fVar154;
    fStack_4d4 = fVar154;
    fStack_4d0 = fVar154;
    fStack_4cc = fVar154;
    fStack_4c8 = fVar154;
    register0x0000139c = fVar154;
    _local_500 = vpermps_avx512vl(auVar194,ZEXT1632(auVar99));
    local_100 = vbroadcastsd_avx512vl(auVar100);
    auVar110 = vmulps_avx512vl(_local_4e0,auVar119);
    auVar108 = vmulps_avx512vl(_local_500,auVar119);
    auVar100 = vfmadd231ps_fma(auVar110,auVar120,local_4a0);
    auVar110 = vfmadd231ps_avx512vl(auVar108,auVar120,local_4c0);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar107,local_460);
    auVar111 = vfmadd231ps_avx512vl(auVar110,auVar107,local_480);
    auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar109,local_420);
    auVar211 = ZEXT3264(auVar112);
    auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90);
    auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0x484);
    auVar118 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0x908);
    auVar113 = vfmadd231ps_avx512vl(auVar111,auVar109,local_440);
    auVar201 = ZEXT3264(auVar113);
    auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0xd8c);
    auVar114 = vmulps_avx512vl(_local_4e0,auVar111);
    auVar106 = vmulps_avx512vl(_local_500,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar118,local_4a0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,local_4c0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar108,local_460);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_480);
    auVar186 = vfmadd231ps_fma(auVar114,auVar110,local_420);
    auVar213 = ZEXT1664(auVar186);
    auVar169 = vfmadd231ps_fma(auVar106,auVar110,local_440);
    auVar114 = vsubps_avx512vl(ZEXT1632(auVar186),auVar112);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar169),auVar113);
    auVar104 = vmulps_avx512vl(auVar113,auVar114);
    auVar105 = vmulps_avx512vl(auVar112,auVar106);
    auVar104 = vsubps_avx512vl(auVar104,auVar105);
    auVar105 = vmulps_avx512vl(local_100,auVar119);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar120,local_e0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_a0);
    auVar115 = vmulps_avx512vl(local_100,auVar111);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,local_e0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar108,local_c0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,local_a0);
    auVar116 = vmulps_avx512vl(auVar106,auVar106);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar114);
    auVar117 = vmaxps_avx512vl(auVar105,auVar115);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar116 = vmulps_avx512vl(auVar117,auVar116);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    uVar26 = vcmpps_avx512vl(auVar104,auVar116,2);
    auVar100 = vblendps_avx(auVar215,auVar96,8);
    auVar98 = auVar232._0_16_;
    auVar100 = vandps_avx512vl(auVar100,auVar98);
    auVar101 = vblendps_avx(auVar217,auVar101,8);
    auVar101 = vandps_avx512vl(auVar101,auVar98);
    auVar100 = vmaxps_avx(auVar100,auVar101);
    auVar101 = vblendps_avx(auVar97,auVar102,8);
    auVar102 = vandps_avx512vl(auVar101,auVar98);
    auVar101 = vblendps_avx(auVar99,auVar30,8);
    auVar101 = vandps_avx512vl(auVar101,auVar98);
    auVar101 = vmaxps_avx(auVar102,auVar101);
    auVar101 = vmaxps_avx(auVar100,auVar101);
    auVar102 = vmovshdup_avx(auVar101);
    auVar102 = vmaxss_avx(auVar102,auVar101);
    auVar101 = vshufpd_avx(auVar101,auVar101,1);
    auVar101 = vmaxss_avx(auVar101,auVar102);
    auVar102 = vcvtsi2ss_avx512f(auVar98,iVar15);
    local_5a0._0_16_ = auVar102;
    auVar222._0_4_ = auVar102._0_4_;
    auVar222._4_4_ = auVar222._0_4_;
    auVar222._8_4_ = auVar222._0_4_;
    auVar222._12_4_ = auVar222._0_4_;
    auVar222._16_4_ = auVar222._0_4_;
    auVar222._20_4_ = auVar222._0_4_;
    auVar222._24_4_ = auVar222._0_4_;
    auVar222._28_4_ = auVar222._0_4_;
    uVar27 = vcmpps_avx512vl(auVar222,_DAT_01f7b060,0xe);
    bVar94 = (byte)uVar26 & (byte)uVar27;
    fVar171 = auVar101._0_4_ * 4.7683716e-07;
    local_640 = ZEXT416((uint)fVar171);
    auVar188._8_4_ = 2;
    auVar188._0_8_ = 0x200000002;
    auVar188._12_4_ = 2;
    auVar188._16_4_ = 2;
    auVar188._20_4_ = 2;
    auVar188._24_4_ = 2;
    auVar188._28_4_ = 2;
    local_560 = vpermps_avx512vl(auVar188,ZEXT1632(auVar215));
    auVar231 = ZEXT3264(local_560);
    local_580 = vpermps_avx512vl(auVar188,ZEXT1632(auVar217));
    auVar233 = ZEXT3264(local_580);
    auVar104 = vpermps_avx512vl(auVar188,ZEXT1632(auVar97));
    auVar230 = ZEXT3264(auVar104);
    local_280 = vpermps_avx2(auVar188,ZEXT1632(auVar99));
    local_520 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_51c = 0;
    uStack_518 = 0;
    uStack_514 = 0;
    local_2a0 = vpbroadcastd_avx512vl();
    local_2c0 = vpbroadcastd_avx512vl();
    if (bVar94 != 0) {
      auVar111 = vmulps_avx512vl(local_280,auVar111);
      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar104,auVar111);
      auVar108 = vfmadd213ps_avx512vl(auVar108,local_580,auVar118);
      auVar108 = vfmadd213ps_avx512vl(auVar110,local_560,auVar108);
      auVar119 = vmulps_avx512vl(local_280,auVar119);
      auVar120 = vfmadd213ps_avx512vl(auVar120,auVar104,auVar119);
      auVar118 = vfmadd213ps_avx512vl(auVar107,local_580,auVar120);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0x1210);
      auVar120 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0x1694);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0x1b18);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 + 0x1f9c);
      auVar118 = vfmadd213ps_avx512vl(auVar109,local_560,auVar118);
      auVar218._0_4_ = fVar154 * auVar110._0_4_;
      auVar218._4_4_ = fVar154 * auVar110._4_4_;
      auVar218._8_4_ = fVar154 * auVar110._8_4_;
      auVar218._12_4_ = fVar154 * auVar110._12_4_;
      auVar218._16_4_ = fVar154 * auVar110._16_4_;
      auVar218._20_4_ = fVar154 * auVar110._20_4_;
      auVar218._24_4_ = fVar154 * auVar110._24_4_;
      auVar218._28_4_ = 0;
      auVar109 = vmulps_avx512vl(_local_500,auVar110);
      auVar110 = vmulps_avx512vl(local_280,auVar110);
      auVar111 = vfmadd231ps_avx512vl(auVar218,auVar119,local_4a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar119,local_4c0);
      auVar119 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar119);
      auVar110 = vfmadd231ps_avx512vl(auVar111,auVar120,local_460);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,local_480);
      auVar111 = vfmadd231ps_avx512vl(auVar119,local_580,auVar120);
      auVar101 = vfmadd231ps_fma(auVar110,auVar107,local_420);
      auVar110 = vfmadd231ps_avx512vl(auVar109,auVar107,local_440);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0x1210);
      auVar120 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0x1b18);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0x1f9c);
      auVar111 = vfmadd231ps_avx512vl(auVar111,local_560,auVar107);
      auVar40._4_4_ = fVar154 * auVar119._4_4_;
      auVar40._0_4_ = fVar154 * auVar119._0_4_;
      auVar40._8_4_ = fVar154 * auVar119._8_4_;
      auVar40._12_4_ = fVar154 * auVar119._12_4_;
      auVar40._16_4_ = fVar154 * auVar119._16_4_;
      auVar40._20_4_ = fVar154 * auVar119._20_4_;
      auVar40._24_4_ = fVar154 * auVar119._24_4_;
      auVar40._28_4_ = auVar107._28_4_;
      auVar107 = vmulps_avx512vl(_local_500,auVar119);
      auVar119 = vmulps_avx512vl(local_280,auVar119);
      auVar116 = vfmadd231ps_avx512vl(auVar40,auVar120,local_4a0);
      auVar117 = vfmadd231ps_avx512vl(auVar107,auVar120,local_4c0);
      auVar120 = vfmadd231ps_avx512vl(auVar119,auVar104,auVar120);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 + 0x1694);
      auVar119 = vfmadd231ps_avx512vl(auVar116,auVar107,local_460);
      auVar116 = vfmadd231ps_avx512vl(auVar117,auVar107,local_480);
      auVar107 = vfmadd231ps_avx512vl(auVar120,local_580,auVar107);
      auVar102 = vfmadd231ps_fma(auVar119,auVar109,local_420);
      auVar120 = vfmadd231ps_avx512vl(auVar116,auVar109,local_440);
      auVar119 = vfmadd231ps_avx512vl(auVar107,local_560,auVar109);
      auVar228._8_4_ = 0x7fffffff;
      auVar228._0_8_ = 0x7fffffff7fffffff;
      auVar228._12_4_ = 0x7fffffff;
      auVar228._16_4_ = 0x7fffffff;
      auVar228._20_4_ = 0x7fffffff;
      auVar228._24_4_ = 0x7fffffff;
      auVar228._28_4_ = 0x7fffffff;
      auVar109 = vandps_avx(ZEXT1632(auVar101),auVar228);
      auVar107 = vandps_avx(auVar110,auVar228);
      auVar107 = vmaxps_avx(auVar109,auVar107);
      auVar109 = vandps_avx(auVar111,auVar228);
      auVar109 = vmaxps_avx(auVar107,auVar109);
      auVar223._4_4_ = fVar171;
      auVar223._0_4_ = fVar171;
      auVar223._8_4_ = fVar171;
      auVar223._12_4_ = fVar171;
      auVar223._16_4_ = fVar171;
      auVar223._20_4_ = fVar171;
      auVar223._24_4_ = fVar171;
      auVar223._28_4_ = fVar171;
      uVar86 = vcmpps_avx512vl(auVar109,auVar223,1);
      bVar18 = (bool)((byte)uVar86 & 1);
      auVar121._0_4_ = (float)((uint)bVar18 * auVar114._0_4_ | (uint)!bVar18 * auVar101._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar18 * auVar114._4_4_ | (uint)!bVar18 * auVar101._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar18 * auVar114._8_4_ | (uint)!bVar18 * auVar101._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar18 * auVar114._12_4_ | (uint)!bVar18 * auVar101._12_4_);
      fVar167 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar114._16_4_);
      auVar121._16_4_ = fVar167;
      fVar166 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar114._20_4_);
      auVar121._20_4_ = fVar166;
      fVar154 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar114._24_4_);
      auVar121._24_4_ = fVar154;
      uVar93 = (uint)(byte)(uVar86 >> 7) * auVar114._28_4_;
      auVar121._28_4_ = uVar93;
      bVar18 = (bool)((byte)uVar86 & 1);
      auVar122._0_4_ = (float)((uint)bVar18 * auVar106._0_4_ | (uint)!bVar18 * auVar110._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar122._4_4_ = (float)((uint)bVar18 * auVar106._4_4_ | (uint)!bVar18 * auVar110._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar122._8_4_ = (float)((uint)bVar18 * auVar106._8_4_ | (uint)!bVar18 * auVar110._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar122._12_4_ = (float)((uint)bVar18 * auVar106._12_4_ | (uint)!bVar18 * auVar110._12_4_);
      bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar122._16_4_ = (float)((uint)bVar18 * auVar106._16_4_ | (uint)!bVar18 * auVar110._16_4_);
      bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar122._20_4_ = (float)((uint)bVar18 * auVar106._20_4_ | (uint)!bVar18 * auVar110._20_4_);
      bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar122._24_4_ = (float)((uint)bVar18 * auVar106._24_4_ | (uint)!bVar18 * auVar110._24_4_);
      bVar18 = SUB81(uVar86 >> 7,0);
      auVar122._28_4_ = (uint)bVar18 * auVar106._28_4_ | (uint)!bVar18 * auVar110._28_4_;
      auVar109 = vandps_avx(auVar228,ZEXT1632(auVar102));
      auVar107 = vandps_avx(auVar120,auVar228);
      auVar107 = vmaxps_avx(auVar109,auVar107);
      auVar109 = vandps_avx(auVar119,auVar228);
      auVar109 = vmaxps_avx(auVar107,auVar109);
      uVar86 = vcmpps_avx512vl(auVar109,auVar223,1);
      bVar18 = (bool)((byte)uVar86 & 1);
      auVar123._0_4_ = (float)((uint)bVar18 * auVar114._0_4_ | (uint)!bVar18 * auVar102._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar18 * auVar114._4_4_ | (uint)!bVar18 * auVar102._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar18 * auVar114._8_4_ | (uint)!bVar18 * auVar102._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar18 * auVar114._12_4_ | (uint)!bVar18 * auVar102._12_4_);
      fVar192 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar114._16_4_);
      auVar123._16_4_ = fVar192;
      fVar177 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar114._20_4_);
      auVar123._20_4_ = fVar177;
      fVar178 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar114._24_4_);
      auVar123._24_4_ = fVar178;
      auVar123._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar114._28_4_;
      bVar18 = (bool)((byte)uVar86 & 1);
      auVar124._0_4_ = (float)((uint)bVar18 * auVar106._0_4_ | (uint)!bVar18 * auVar120._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar18 * auVar106._4_4_ | (uint)!bVar18 * auVar120._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar18 * auVar106._8_4_ | (uint)!bVar18 * auVar120._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar18 * auVar106._12_4_ | (uint)!bVar18 * auVar120._12_4_);
      bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar124._16_4_ = (float)((uint)bVar18 * auVar106._16_4_ | (uint)!bVar18 * auVar120._16_4_);
      bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar124._20_4_ = (float)((uint)bVar18 * auVar106._20_4_ | (uint)!bVar18 * auVar120._20_4_);
      bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar124._24_4_ = (float)((uint)bVar18 * auVar106._24_4_ | (uint)!bVar18 * auVar120._24_4_);
      bVar18 = SUB81(uVar86 >> 7,0);
      auVar124._28_4_ = (uint)bVar18 * auVar106._28_4_ | (uint)!bVar18 * auVar120._28_4_;
      auVar103 = vxorps_avx512vl(auVar103,auVar103);
      auVar109 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar103));
      auVar101 = vfmadd231ps_fma(auVar109,auVar122,auVar122);
      auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
      fVar95 = auVar109._0_4_;
      fVar176 = auVar109._4_4_;
      fVar146 = auVar109._8_4_;
      fVar147 = auVar109._12_4_;
      fVar148 = auVar109._16_4_;
      fVar149 = auVar109._20_4_;
      fVar150 = auVar109._24_4_;
      auVar41._4_4_ = fVar176 * fVar176 * fVar176 * auVar101._4_4_ * -0.5;
      auVar41._0_4_ = fVar95 * fVar95 * fVar95 * auVar101._0_4_ * -0.5;
      auVar41._8_4_ = fVar146 * fVar146 * fVar146 * auVar101._8_4_ * -0.5;
      auVar41._12_4_ = fVar147 * fVar147 * fVar147 * auVar101._12_4_ * -0.5;
      auVar41._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
      auVar41._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
      auVar41._24_4_ = fVar150 * fVar150 * fVar150 * -0.0;
      auVar41._28_4_ = 0;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar120 = vfmadd231ps_avx512vl(auVar41,auVar107,auVar109);
      auVar42._4_4_ = auVar122._4_4_ * auVar120._4_4_;
      auVar42._0_4_ = auVar122._0_4_ * auVar120._0_4_;
      auVar42._8_4_ = auVar122._8_4_ * auVar120._8_4_;
      auVar42._12_4_ = auVar122._12_4_ * auVar120._12_4_;
      auVar42._16_4_ = auVar122._16_4_ * auVar120._16_4_;
      auVar42._20_4_ = auVar122._20_4_ * auVar120._20_4_;
      auVar42._24_4_ = auVar122._24_4_ * auVar120._24_4_;
      auVar42._28_4_ = auVar109._28_4_;
      auVar43._4_4_ = auVar120._4_4_ * -auVar121._4_4_;
      auVar43._0_4_ = auVar120._0_4_ * -auVar121._0_4_;
      auVar43._8_4_ = auVar120._8_4_ * -auVar121._8_4_;
      auVar43._12_4_ = auVar120._12_4_ * -auVar121._12_4_;
      auVar43._16_4_ = auVar120._16_4_ * -fVar167;
      auVar43._20_4_ = auVar120._20_4_ * -fVar166;
      auVar43._24_4_ = auVar120._24_4_ * -fVar154;
      auVar43._28_4_ = uVar93 ^ 0x80000000;
      auVar109 = vmulps_avx512vl(auVar120,ZEXT1632(auVar103));
      auVar111 = ZEXT1632(auVar103);
      auVar119 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar111);
      auVar101 = vfmadd231ps_fma(auVar119,auVar124,auVar124);
      auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
      fVar154 = auVar119._0_4_;
      fVar166 = auVar119._4_4_;
      fVar167 = auVar119._8_4_;
      fVar95 = auVar119._12_4_;
      fVar176 = auVar119._16_4_;
      fVar146 = auVar119._20_4_;
      fVar147 = auVar119._24_4_;
      auVar44._4_4_ = fVar166 * fVar166 * fVar166 * auVar101._4_4_ * -0.5;
      auVar44._0_4_ = fVar154 * fVar154 * fVar154 * auVar101._0_4_ * -0.5;
      auVar44._8_4_ = fVar167 * fVar167 * fVar167 * auVar101._8_4_ * -0.5;
      auVar44._12_4_ = fVar95 * fVar95 * fVar95 * auVar101._12_4_ * -0.5;
      auVar44._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
      auVar44._20_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar44._24_4_ = fVar147 * fVar147 * fVar147 * -0.0;
      auVar44._28_4_ = 0;
      auVar107 = vfmadd231ps_avx512vl(auVar44,auVar107,auVar119);
      auVar45._4_4_ = auVar124._4_4_ * auVar107._4_4_;
      auVar45._0_4_ = auVar124._0_4_ * auVar107._0_4_;
      auVar45._8_4_ = auVar124._8_4_ * auVar107._8_4_;
      auVar45._12_4_ = auVar124._12_4_ * auVar107._12_4_;
      auVar45._16_4_ = auVar124._16_4_ * auVar107._16_4_;
      auVar45._20_4_ = auVar124._20_4_ * auVar107._20_4_;
      auVar45._24_4_ = auVar124._24_4_ * auVar107._24_4_;
      auVar45._28_4_ = auVar119._28_4_;
      auVar46._4_4_ = -auVar123._4_4_ * auVar107._4_4_;
      auVar46._0_4_ = -auVar123._0_4_ * auVar107._0_4_;
      auVar46._8_4_ = -auVar123._8_4_ * auVar107._8_4_;
      auVar46._12_4_ = -auVar123._12_4_ * auVar107._12_4_;
      auVar46._16_4_ = -fVar192 * auVar107._16_4_;
      auVar46._20_4_ = -fVar177 * auVar107._20_4_;
      auVar46._24_4_ = -fVar178 * auVar107._24_4_;
      auVar46._28_4_ = auVar120._28_4_;
      auVar107 = vmulps_avx512vl(auVar107,auVar111);
      auVar101 = vfmadd213ps_fma(auVar42,auVar105,auVar112);
      auVar102 = vfmadd213ps_fma(auVar43,auVar105,auVar113);
      auVar120 = vfmadd213ps_avx512vl(auVar109,auVar105,auVar118);
      auVar119 = vfmadd213ps_avx512vl(auVar45,auVar115,ZEXT1632(auVar186));
      auVar97 = vfnmadd213ps_fma(auVar42,auVar105,auVar112);
      auVar100 = vfmadd213ps_fma(auVar46,auVar115,ZEXT1632(auVar169));
      auVar215 = vfnmadd213ps_fma(auVar43,auVar105,auVar113);
      auVar99 = vfmadd213ps_fma(auVar107,auVar115,auVar108);
      auVar110 = vfnmadd231ps_avx512vl(auVar118,auVar105,auVar109);
      auVar217 = vfnmadd213ps_fma(auVar45,auVar115,ZEXT1632(auVar186));
      auVar30 = vfnmadd213ps_fma(auVar46,auVar115,ZEXT1632(auVar169));
      auVar98 = vfnmadd231ps_fma(auVar108,auVar115,auVar107);
      auVar107 = vsubps_avx512vl(auVar119,ZEXT1632(auVar97));
      auVar109 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar215));
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar99),auVar110);
      auVar118 = vmulps_avx512vl(auVar109,auVar110);
      auVar186 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar215),auVar108);
      auVar47._4_4_ = auVar97._4_4_ * auVar108._4_4_;
      auVar47._0_4_ = auVar97._0_4_ * auVar108._0_4_;
      auVar47._8_4_ = auVar97._8_4_ * auVar108._8_4_;
      auVar47._12_4_ = auVar97._12_4_ * auVar108._12_4_;
      auVar47._16_4_ = auVar108._16_4_ * 0.0;
      auVar47._20_4_ = auVar108._20_4_ * 0.0;
      auVar47._24_4_ = auVar108._24_4_ * 0.0;
      auVar47._28_4_ = auVar108._28_4_;
      auVar108 = vfmsub231ps_avx512vl(auVar47,auVar110,auVar107);
      auVar48._4_4_ = auVar215._4_4_ * auVar107._4_4_;
      auVar48._0_4_ = auVar215._0_4_ * auVar107._0_4_;
      auVar48._8_4_ = auVar215._8_4_ * auVar107._8_4_;
      auVar48._12_4_ = auVar215._12_4_ * auVar107._12_4_;
      auVar48._16_4_ = auVar107._16_4_ * 0.0;
      auVar48._20_4_ = auVar107._20_4_ * 0.0;
      auVar48._24_4_ = auVar107._24_4_ * 0.0;
      auVar48._28_4_ = auVar107._28_4_;
      auVar169 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar97),auVar109);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar169),auVar111,auVar108);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,ZEXT1632(auVar186));
      auVar106 = ZEXT1632(auVar103);
      uVar86 = vcmpps_avx512vl(auVar109,auVar106,2);
      bVar85 = (byte)uVar86;
      fVar95 = (float)((uint)(bVar85 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar217._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      fVar146 = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar217._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      fVar148 = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar217._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      fVar150 = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar217._12_4_);
      auVar118 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar148,CONCAT44(fVar146,fVar95))));
      fVar176 = (float)((uint)(bVar85 & 1) * auVar102._0_4_ |
                       (uint)!(bool)(bVar85 & 1) * auVar30._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      fVar147 = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar30._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      fVar149 = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar30._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      fVar151 = (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar30._12_4_);
      auVar111 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar176))));
      auVar125._0_4_ =
           (float)((uint)(bVar85 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar98._0_4_);
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar125._4_4_ = (float)((uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * auVar98._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar125._8_4_ = (float)((uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * auVar98._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar125._12_4_ = (float)((uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * auVar98._12_4_);
      fVar167 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar120._16_4_);
      auVar125._16_4_ = fVar167;
      fVar154 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar120._20_4_);
      auVar125._20_4_ = fVar154;
      fVar166 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar120._24_4_);
      auVar125._24_4_ = fVar166;
      iVar1 = (uint)(byte)(uVar86 >> 7) * auVar120._28_4_;
      auVar125._28_4_ = iVar1;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar97),auVar119);
      auVar126._0_4_ =
           (uint)(bVar85 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar102._0_4_;
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar102._4_4_;
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar102._8_4_;
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar102._12_4_;
      auVar126._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar107._16_4_;
      auVar126._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar107._20_4_;
      auVar126._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar107._24_4_;
      auVar126._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar215),ZEXT1632(auVar100));
      auVar127._0_4_ =
           (float)((uint)(bVar85 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar186._0_4_)
      ;
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar127._4_4_ = (float)((uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar186._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar127._8_4_ = (float)((uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar186._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar127._12_4_ = (float)((uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar186._12_4_);
      fVar178 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar107._16_4_);
      auVar127._16_4_ = fVar178;
      fVar177 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar107._20_4_);
      auVar127._20_4_ = fVar177;
      fVar192 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar107._24_4_);
      auVar127._24_4_ = fVar192;
      auVar127._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar99));
      auVar128._0_4_ =
           (float)((uint)(bVar85 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar120._0_4_)
      ;
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar128._4_4_ = (float)((uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar120._4_4_);
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar128._8_4_ = (float)((uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar120._8_4_);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar128._12_4_ = (float)((uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar120._12_4_);
      bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar128._16_4_ = (float)((uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * auVar120._16_4_);
      bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar128._20_4_ = (float)((uint)bVar18 * auVar107._20_4_ | (uint)!bVar18 * auVar120._20_4_);
      bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar128._24_4_ = (float)((uint)bVar18 * auVar107._24_4_ | (uint)!bVar18 * auVar120._24_4_);
      bVar18 = SUB81(uVar86 >> 7,0);
      auVar128._28_4_ = (uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * auVar120._28_4_;
      auVar129._0_4_ =
           (uint)(bVar85 & 1) * (int)auVar97._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar119._0_4_;
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar18 * (int)auVar97._4_4_ | (uint)!bVar18 * auVar119._4_4_;
      bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar18 * (int)auVar97._8_4_ | (uint)!bVar18 * auVar119._8_4_;
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar18 * (int)auVar97._12_4_ | (uint)!bVar18 * auVar119._12_4_;
      auVar129._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar119._16_4_;
      auVar129._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar119._20_4_;
      auVar129._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar119._24_4_;
      auVar129._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar119._28_4_;
      bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar86 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar130._0_4_ =
           (uint)(bVar85 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar99._0_4_;
      bVar19 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar19 * auVar110._4_4_ | (uint)!bVar19 * auVar99._4_4_;
      bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * auVar99._8_4_;
      bVar19 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar19 * auVar110._12_4_ | (uint)!bVar19 * auVar99._12_4_;
      auVar130._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar110._16_4_;
      auVar130._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar110._20_4_;
      auVar130._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar110._24_4_;
      iVar2 = (uint)(byte)(uVar86 >> 7) * auVar110._28_4_;
      auVar130._28_4_ = iVar2;
      auVar112 = vsubps_avx512vl(auVar129,auVar118);
      auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar215._12_4_ |
                                               (uint)!bVar21 * auVar100._12_4_,
                                               CONCAT48((uint)bVar20 * (int)auVar215._8_4_ |
                                                        (uint)!bVar20 * auVar100._8_4_,
                                                        CONCAT44((uint)bVar18 * (int)auVar215._4_4_
                                                                 | (uint)!bVar18 * auVar100._4_4_,
                                                                 (uint)(bVar85 & 1) *
                                                                 (int)auVar215._0_4_ |
                                                                 (uint)!(bool)(bVar85 & 1) *
                                                                 auVar100._0_4_)))),auVar111);
      auVar211 = ZEXT3264(auVar107);
      auVar120 = vsubps_avx(auVar130,auVar125);
      auVar119 = vsubps_avx(auVar118,auVar126);
      auVar213 = ZEXT3264(auVar119);
      auVar110 = vsubps_avx(auVar111,auVar127);
      auVar108 = vsubps_avx(auVar125,auVar128);
      auVar49._4_4_ = auVar120._4_4_ * fVar146;
      auVar49._0_4_ = auVar120._0_4_ * fVar95;
      auVar49._8_4_ = auVar120._8_4_ * fVar148;
      auVar49._12_4_ = auVar120._12_4_ * fVar150;
      auVar49._16_4_ = auVar120._16_4_ * 0.0;
      auVar49._20_4_ = auVar120._20_4_ * 0.0;
      auVar49._24_4_ = auVar120._24_4_ * 0.0;
      auVar49._28_4_ = iVar2;
      auVar101 = vfmsub231ps_fma(auVar49,auVar125,auVar112);
      auVar50._4_4_ = fVar147 * auVar112._4_4_;
      auVar50._0_4_ = fVar176 * auVar112._0_4_;
      auVar50._8_4_ = fVar149 * auVar112._8_4_;
      auVar50._12_4_ = fVar151 * auVar112._12_4_;
      auVar50._16_4_ = auVar112._16_4_ * 0.0;
      auVar50._20_4_ = auVar112._20_4_ * 0.0;
      auVar50._24_4_ = auVar112._24_4_ * 0.0;
      auVar50._28_4_ = auVar109._28_4_;
      auVar102 = vfmsub231ps_fma(auVar50,auVar118,auVar107);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar106,ZEXT1632(auVar101));
      auVar195._0_4_ = auVar107._0_4_ * auVar125._0_4_;
      auVar195._4_4_ = auVar107._4_4_ * auVar125._4_4_;
      auVar195._8_4_ = auVar107._8_4_ * auVar125._8_4_;
      auVar195._12_4_ = auVar107._12_4_ * auVar125._12_4_;
      auVar195._16_4_ = auVar107._16_4_ * fVar167;
      auVar195._20_4_ = auVar107._20_4_ * fVar154;
      auVar195._24_4_ = auVar107._24_4_ * fVar166;
      auVar195._28_4_ = 0;
      auVar101 = vfmsub231ps_fma(auVar195,auVar111,auVar120);
      auVar113 = vfmadd231ps_avx512vl(auVar109,auVar106,ZEXT1632(auVar101));
      auVar109 = vmulps_avx512vl(auVar108,auVar126);
      auVar109 = vfmsub231ps_avx512vl(auVar109,auVar119,auVar128);
      auVar51._4_4_ = auVar110._4_4_ * auVar128._4_4_;
      auVar51._0_4_ = auVar110._0_4_ * auVar128._0_4_;
      auVar51._8_4_ = auVar110._8_4_ * auVar128._8_4_;
      auVar51._12_4_ = auVar110._12_4_ * auVar128._12_4_;
      auVar51._16_4_ = auVar110._16_4_ * auVar128._16_4_;
      auVar51._20_4_ = auVar110._20_4_ * auVar128._20_4_;
      auVar51._24_4_ = auVar110._24_4_ * auVar128._24_4_;
      auVar51._28_4_ = auVar128._28_4_;
      auVar101 = vfmsub231ps_fma(auVar51,auVar127,auVar108);
      auVar196._0_4_ = auVar127._0_4_ * auVar119._0_4_;
      auVar196._4_4_ = auVar127._4_4_ * auVar119._4_4_;
      auVar196._8_4_ = auVar127._8_4_ * auVar119._8_4_;
      auVar196._12_4_ = auVar127._12_4_ * auVar119._12_4_;
      auVar196._16_4_ = fVar178 * auVar119._16_4_;
      auVar196._20_4_ = fVar177 * auVar119._20_4_;
      auVar196._24_4_ = fVar192 * auVar119._24_4_;
      auVar196._28_4_ = 0;
      auVar102 = vfmsub231ps_fma(auVar196,auVar110,auVar126);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar106,auVar109);
      auVar114 = vfmadd231ps_avx512vl(auVar109,auVar106,ZEXT1632(auVar101));
      auVar201 = ZEXT3264(auVar114);
      auVar109 = vmaxps_avx(auVar113,auVar114);
      uVar26 = vcmpps_avx512vl(auVar109,auVar106,2);
      bVar94 = bVar94 & (byte)uVar26;
      if (bVar94 != 0) {
        auVar52._4_4_ = auVar108._4_4_ * auVar107._4_4_;
        auVar52._0_4_ = auVar108._0_4_ * auVar107._0_4_;
        auVar52._8_4_ = auVar108._8_4_ * auVar107._8_4_;
        auVar52._12_4_ = auVar108._12_4_ * auVar107._12_4_;
        auVar52._16_4_ = auVar108._16_4_ * auVar107._16_4_;
        auVar52._20_4_ = auVar108._20_4_ * auVar107._20_4_;
        auVar52._24_4_ = auVar108._24_4_ * auVar107._24_4_;
        auVar52._28_4_ = auVar109._28_4_;
        auVar186 = vfmsub231ps_fma(auVar52,auVar110,auVar120);
        auVar53._4_4_ = auVar120._4_4_ * auVar119._4_4_;
        auVar53._0_4_ = auVar120._0_4_ * auVar119._0_4_;
        auVar53._8_4_ = auVar120._8_4_ * auVar119._8_4_;
        auVar53._12_4_ = auVar120._12_4_ * auVar119._12_4_;
        auVar53._16_4_ = auVar120._16_4_ * auVar119._16_4_;
        auVar53._20_4_ = auVar120._20_4_ * auVar119._20_4_;
        auVar53._24_4_ = auVar120._24_4_ * auVar119._24_4_;
        auVar53._28_4_ = auVar120._28_4_;
        auVar100 = vfmsub231ps_fma(auVar53,auVar112,auVar108);
        auVar54._4_4_ = auVar110._4_4_ * auVar112._4_4_;
        auVar54._0_4_ = auVar110._0_4_ * auVar112._0_4_;
        auVar54._8_4_ = auVar110._8_4_ * auVar112._8_4_;
        auVar54._12_4_ = auVar110._12_4_ * auVar112._12_4_;
        auVar54._16_4_ = auVar110._16_4_ * auVar112._16_4_;
        auVar54._20_4_ = auVar110._20_4_ * auVar112._20_4_;
        auVar54._24_4_ = auVar110._24_4_ * auVar112._24_4_;
        auVar54._28_4_ = auVar110._28_4_;
        auVar169 = vfmsub231ps_fma(auVar54,auVar119,auVar107);
        auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar169));
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar186),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar102));
        auVar213 = ZEXT3264(auVar109);
        auVar31._8_4_ = 0x3f800000;
        auVar31._0_8_ = 0x3f8000003f800000;
        auVar31._12_4_ = 0x3f800000;
        auVar31._16_4_ = 0x3f800000;
        auVar31._20_4_ = 0x3f800000;
        auVar31._24_4_ = 0x3f800000;
        auVar31._28_4_ = 0x3f800000;
        auVar107 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar102),auVar31);
        auVar101 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
        auVar211 = ZEXT1664(auVar101);
        auVar55._4_4_ = auVar169._4_4_ * auVar125._4_4_;
        auVar55._0_4_ = auVar169._0_4_ * auVar125._0_4_;
        auVar55._8_4_ = auVar169._8_4_ * auVar125._8_4_;
        auVar55._12_4_ = auVar169._12_4_ * auVar125._12_4_;
        auVar55._16_4_ = fVar167 * 0.0;
        auVar55._20_4_ = fVar154 * 0.0;
        auVar55._24_4_ = fVar166 * 0.0;
        auVar55._28_4_ = iVar1;
        auVar100 = vfmadd231ps_fma(auVar55,auVar111,ZEXT1632(auVar100));
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar118,ZEXT1632(auVar186));
        fVar154 = auVar101._0_4_;
        fVar166 = auVar101._4_4_;
        fVar167 = auVar101._8_4_;
        fVar178 = auVar101._12_4_;
        local_3c0 = ZEXT1632(CONCAT412(auVar100._12_4_ * fVar178,
                                       CONCAT48(auVar100._8_4_ * fVar167,
                                                CONCAT44(auVar100._4_4_ * fVar166,
                                                         auVar100._0_4_ * fVar154))));
        auVar221 = ZEXT3264(local_3c0);
        auVar158._4_4_ = local_520;
        auVar158._0_4_ = local_520;
        auVar158._8_4_ = local_520;
        auVar158._12_4_ = local_520;
        auVar158._16_4_ = local_520;
        auVar158._20_4_ = local_520;
        auVar158._24_4_ = local_520;
        auVar158._28_4_ = local_520;
        uVar26 = vcmpps_avx512vl(auVar158,local_3c0,2);
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar155;
        auVar32._0_4_ = uVar155;
        auVar32._8_4_ = uVar155;
        auVar32._12_4_ = uVar155;
        auVar32._16_4_ = uVar155;
        auVar32._20_4_ = uVar155;
        auVar32._24_4_ = uVar155;
        auVar32._28_4_ = uVar155;
        uVar27 = vcmpps_avx512vl(local_3c0,auVar32,2);
        bVar94 = (byte)uVar26 & (byte)uVar27 & bVar94;
        if (bVar94 != 0) {
          uVar92 = vcmpps_avx512vl(ZEXT1632(auVar102),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar92 = bVar94 & uVar92;
          if ((char)uVar92 != '\0') {
            fVar177 = auVar113._0_4_ * fVar154;
            fVar192 = auVar113._4_4_ * fVar166;
            auVar56._4_4_ = fVar192;
            auVar56._0_4_ = fVar177;
            fVar95 = auVar113._8_4_ * fVar167;
            auVar56._8_4_ = fVar95;
            fVar176 = auVar113._12_4_ * fVar178;
            auVar56._12_4_ = fVar176;
            fVar146 = auVar113._16_4_ * 0.0;
            auVar56._16_4_ = fVar146;
            fVar147 = auVar113._20_4_ * 0.0;
            auVar56._20_4_ = fVar147;
            fVar148 = auVar113._24_4_ * 0.0;
            auVar56._24_4_ = fVar148;
            auVar56._28_4_ = auVar113._28_4_;
            auVar159._8_4_ = 0x3f800000;
            auVar159._0_8_ = 0x3f8000003f800000;
            auVar159._12_4_ = 0x3f800000;
            auVar159._16_4_ = 0x3f800000;
            auVar159._20_4_ = 0x3f800000;
            auVar159._24_4_ = 0x3f800000;
            auVar159._28_4_ = 0x3f800000;
            auVar109 = vsubps_avx(auVar159,auVar56);
            local_400._0_4_ =
                 (float)((uint)(bVar85 & 1) * (int)fVar177 |
                        (uint)!(bool)(bVar85 & 1) * auVar109._0_4_);
            bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
            local_400._4_4_ = (float)((uint)bVar18 * (int)fVar192 | (uint)!bVar18 * auVar109._4_4_);
            bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
            local_400._8_4_ = (float)((uint)bVar18 * (int)fVar95 | (uint)!bVar18 * auVar109._8_4_);
            bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
            local_400._12_4_ =
                 (float)((uint)bVar18 * (int)fVar176 | (uint)!bVar18 * auVar109._12_4_);
            bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
            local_400._16_4_ =
                 (float)((uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar109._16_4_);
            bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
            local_400._20_4_ =
                 (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar109._20_4_);
            bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
            local_400._24_4_ =
                 (float)((uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar109._24_4_);
            bVar18 = SUB81(uVar86 >> 7,0);
            local_400._28_4_ =
                 (float)((uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar109._28_4_);
            auVar109 = vsubps_avx(auVar115,auVar105);
            auVar101 = vfmadd213ps_fma(auVar109,local_400,auVar105);
            uVar155 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar33._4_4_ = uVar155;
            auVar33._0_4_ = uVar155;
            auVar33._8_4_ = uVar155;
            auVar33._12_4_ = uVar155;
            auVar33._16_4_ = uVar155;
            auVar33._20_4_ = uVar155;
            auVar33._24_4_ = uVar155;
            auVar33._28_4_ = uVar155;
            auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar101._12_4_ + auVar101._12_4_,
                                                          CONCAT48(auVar101._8_4_ + auVar101._8_4_,
                                                                   CONCAT44(auVar101._4_4_ +
                                                                            auVar101._4_4_,
                                                                            auVar101._0_4_ +
                                                                            auVar101._0_4_)))),
                                       auVar33);
            uVar28 = vcmpps_avx512vl(local_3c0,auVar109,6);
            uVar92 = uVar92 & uVar28;
            bVar94 = (byte)uVar92;
            if (bVar94 != 0) {
              auVar174._0_4_ = auVar114._0_4_ * fVar154;
              auVar174._4_4_ = auVar114._4_4_ * fVar166;
              auVar174._8_4_ = auVar114._8_4_ * fVar167;
              auVar174._12_4_ = auVar114._12_4_ * fVar178;
              auVar174._16_4_ = auVar114._16_4_ * 0.0;
              auVar174._20_4_ = auVar114._20_4_ * 0.0;
              auVar174._24_4_ = auVar114._24_4_ * 0.0;
              auVar174._28_4_ = 0;
              auVar189._8_4_ = 0x3f800000;
              auVar189._0_8_ = 0x3f8000003f800000;
              auVar189._12_4_ = 0x3f800000;
              auVar189._16_4_ = 0x3f800000;
              auVar189._20_4_ = 0x3f800000;
              auVar189._24_4_ = 0x3f800000;
              auVar189._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar189,auVar174);
              auVar131._0_4_ =
                   (uint)(bVar85 & 1) * (int)auVar174._0_4_ |
                   (uint)!(bool)(bVar85 & 1) * auVar109._0_4_;
              bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
              auVar131._4_4_ = (uint)bVar18 * (int)auVar174._4_4_ | (uint)!bVar18 * auVar109._4_4_;
              bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
              auVar131._8_4_ = (uint)bVar18 * (int)auVar174._8_4_ | (uint)!bVar18 * auVar109._8_4_;
              bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
              auVar131._12_4_ =
                   (uint)bVar18 * (int)auVar174._12_4_ | (uint)!bVar18 * auVar109._12_4_;
              bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
              auVar131._16_4_ =
                   (uint)bVar18 * (int)auVar174._16_4_ | (uint)!bVar18 * auVar109._16_4_;
              bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
              auVar131._20_4_ =
                   (uint)bVar18 * (int)auVar174._20_4_ | (uint)!bVar18 * auVar109._20_4_;
              bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
              auVar131._24_4_ =
                   (uint)bVar18 * (int)auVar174._24_4_ | (uint)!bVar18 * auVar109._24_4_;
              auVar131._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar109._28_4_;
              auVar34._8_4_ = 0x40000000;
              auVar34._0_8_ = 0x4000000040000000;
              auVar34._12_4_ = 0x40000000;
              auVar34._16_4_ = 0x40000000;
              auVar34._20_4_ = 0x40000000;
              auVar34._24_4_ = 0x40000000;
              auVar34._28_4_ = 0x40000000;
              local_3e0 = vfmsub132ps_avx512vl(auVar131,auVar189,auVar34);
              local_3a0 = 0;
              if ((pGVar89->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar171 = 1.0 / auVar222._0_4_;
                local_340[0] = fVar171 * (local_400._0_4_ + 0.0);
                local_340[1] = fVar171 * (local_400._4_4_ + 1.0);
                local_340[2] = fVar171 * (local_400._8_4_ + 2.0);
                local_340[3] = fVar171 * (local_400._12_4_ + 3.0);
                fStack_330 = fVar171 * (local_400._16_4_ + 4.0);
                fStack_32c = fVar171 * (local_400._20_4_ + 5.0);
                fStack_328 = fVar171 * (local_400._24_4_ + 6.0);
                fStack_324 = local_400._28_4_ + 7.0;
                local_320 = local_3e0;
                local_300 = local_3c0;
                auVar160._8_4_ = 0x7f800000;
                auVar160._0_8_ = 0x7f8000007f800000;
                auVar160._12_4_ = 0x7f800000;
                auVar160._16_4_ = 0x7f800000;
                auVar160._20_4_ = 0x7f800000;
                auVar160._24_4_ = 0x7f800000;
                auVar160._28_4_ = 0x7f800000;
                auVar109 = vblendmps_avx512vl(auVar160,local_3c0);
                auVar132._0_4_ =
                     (uint)(bVar94 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar94 & 1) * 0x7f800000;
                bVar18 = (bool)((byte)(uVar92 >> 1) & 1);
                auVar132._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                auVar132._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
                auVar132._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar92 >> 4) & 1);
                auVar132._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                auVar132._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar92 >> 6) & 1);
                auVar132._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = SUB81(uVar92 >> 7,0);
                auVar132._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * 0x7f800000;
                auVar109 = vshufps_avx(auVar132,auVar132,0xb1);
                auVar109 = vminps_avx(auVar132,auVar109);
                auVar107 = vshufpd_avx(auVar109,auVar109,5);
                auVar109 = vminps_avx(auVar109,auVar107);
                auVar107 = vpermpd_avx2(auVar109,0x4e);
                auVar109 = vminps_avx(auVar109,auVar107);
                uVar26 = vcmpps_avx512vl(auVar132,auVar109,0);
                uVar93 = (uint)uVar92;
                if ((bVar94 & (byte)uVar26) != 0) {
                  uVar93 = (uint)(bVar94 & (byte)uVar26);
                }
                uVar87 = 0;
                for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                  uVar87 = uVar87 + 1;
                }
                uVar86 = (ulong)uVar87;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar89->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_540 = *(float *)(ray + k * 4 + 0x100);
                  fStack_53c = 0.0;
                  fStack_538 = 0.0;
                  fStack_534 = 0.0;
                  local_5e0 = auVar104;
                  local_5c0 = local_3c0;
                  local_39c = iVar15;
                  local_390 = auVar96;
                  local_380 = uVar25;
                  uStack_378 = uVar29;
                  local_370 = uVar79;
                  uStack_368 = uVar80;
                  local_360 = uVar81;
                  uStack_358 = uVar82;
                  do {
                    fVar171 = local_340[uVar86];
                    auVar169._4_4_ = fVar171;
                    auVar169._0_4_ = fVar171;
                    auVar169._8_4_ = fVar171;
                    auVar169._12_4_ = fVar171;
                    local_200._16_4_ = fVar171;
                    local_200._0_16_ = auVar169;
                    local_200._20_4_ = fVar171;
                    local_200._24_4_ = fVar171;
                    local_200._28_4_ = fVar171;
                    local_1e0 = *(undefined4 *)(local_320 + uVar86 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar86 * 4);
                    local_670.context = context->user;
                    fVar154 = 1.0 - fVar171;
                    auVar186 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar154 + fVar154))),
                                                ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                    auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar169,
                                               ZEXT416(0xc0a00000));
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                               ZEXT416((uint)(fVar171 + fVar171)),auVar101);
                    auVar213 = ZEXT1664(auVar102);
                    auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar169,
                                               ZEXT416(0x40000000));
                    auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154 * -3.0)),
                                               ZEXT416((uint)(fVar154 + fVar154)),auVar101);
                    auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar169,
                                               ZEXT416((uint)(fVar154 * -2.0)));
                    fVar171 = auVar186._0_4_ * 0.5;
                    fVar154 = auVar102._0_4_ * 0.5;
                    fVar166 = auVar101._0_4_ * 0.5;
                    fVar167 = auVar100._0_4_ * 0.5;
                    auVar186._0_4_ = fVar167 * local_6d0;
                    auVar186._4_4_ = fVar167 * fStack_6cc;
                    auVar186._8_4_ = fVar167 * fStack_6c8;
                    auVar186._12_4_ = fVar167 * fStack_6c4;
                    auVar206._4_4_ = fVar166;
                    auVar206._0_4_ = fVar166;
                    auVar206._8_4_ = fVar166;
                    auVar206._12_4_ = fVar166;
                    auVar101 = vfmadd132ps_fma(auVar206,auVar186,auVar156);
                    auVar187._4_4_ = fVar154;
                    auVar187._0_4_ = fVar154;
                    auVar187._8_4_ = fVar154;
                    auVar187._12_4_ = fVar154;
                    auVar101 = vfmadd132ps_fma(auVar187,auVar101,auVar8);
                    auVar100._4_4_ = fVar171;
                    auVar100._0_4_ = fVar171;
                    auVar100._8_4_ = fVar171;
                    auVar100._12_4_ = fVar171;
                    auVar101 = vfmadd213ps_fma(auVar100,auVar96,auVar101);
                    local_260 = auVar101._0_4_;
                    auVar200._8_4_ = 1;
                    auVar200._0_8_ = 0x100000001;
                    auVar200._12_4_ = 1;
                    auVar200._16_4_ = 1;
                    auVar200._20_4_ = 1;
                    auVar200._24_4_ = 1;
                    auVar200._28_4_ = 1;
                    local_240 = vpermps_avx2(auVar200,ZEXT1632(auVar101));
                    auVar201 = ZEXT3264(local_240);
                    auVar207._8_4_ = 2;
                    auVar207._0_8_ = 0x200000002;
                    auVar207._12_4_ = 2;
                    auVar210._16_4_ = 2;
                    auVar210._0_16_ = auVar207;
                    auVar210._20_4_ = 2;
                    auVar210._24_4_ = 2;
                    auVar210._28_4_ = 2;
                    auVar211 = ZEXT3264(auVar210);
                    local_220 = vpermps_avx2(auVar210,ZEXT1632(auVar101));
                    iStack_25c = local_260;
                    iStack_258 = local_260;
                    iStack_254 = local_260;
                    iStack_250 = local_260;
                    iStack_24c = local_260;
                    iStack_248 = local_260;
                    iStack_244 = local_260;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_2c0._0_8_;
                    uStack_1b8 = local_2c0._8_8_;
                    uStack_1b0 = local_2c0._16_8_;
                    uStack_1a8 = local_2c0._24_8_;
                    local_1a0 = local_2a0;
                    auVar109 = vpcmpeqd_avx2(local_2a0,local_2a0);
                    local_628[1] = auVar109;
                    *local_628 = auVar109;
                    local_180 = (local_670.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_670.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_620 = local_2e0;
                    local_670.valid = (int *)local_620;
                    local_670.geometryUserPtr = pGVar89->userPtr;
                    local_670.hit = (RTCHitN *)&local_260;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar89->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar201 = ZEXT1664(local_240._0_16_);
                      auVar211 = ZEXT1664(auVar207);
                      auVar213 = ZEXT1664(auVar102);
                      (*pGVar89->intersectionFilterN)(&local_670);
                      auVar221 = ZEXT3264(local_5c0);
                      auVar230 = ZEXT3264(local_5e0);
                      auVar233 = ZEXT3264(local_580);
                      auVar231 = ZEXT3264(local_560);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar232 = ZEXT1664(auVar101);
                    }
                    if (local_620 == (undefined1  [32])0x0) {
LAB_01a57a0e:
                      *(float *)(ray + k * 4 + 0x100) = local_540;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar89->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar201 = ZEXT1664(auVar201._0_16_);
                        auVar211 = ZEXT1664(auVar211._0_16_);
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        (*p_Var17)(&local_670);
                        auVar221 = ZEXT3264(local_5c0);
                        auVar230 = ZEXT3264(local_5e0);
                        auVar233 = ZEXT3264(local_580);
                        auVar231 = ZEXT3264(local_560);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar232 = ZEXT1664(auVar101);
                      }
                      if (local_620 == (undefined1  [32])0x0) goto LAB_01a57a0e;
                      uVar28 = vptestmd_avx512vl(local_620,local_620);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar74 = *(int *)(local_670.hit + 0xc);
                      iVar75 = *(int *)(local_670.hit + 0x10);
                      iVar76 = *(int *)(local_670.hit + 0x14);
                      iVar77 = *(int *)(local_670.hit + 0x18);
                      iVar78 = *(int *)(local_670.hit + 0x1c);
                      bVar94 = (byte)uVar28;
                      bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar24 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar94 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar74 = *(int *)(local_670.hit + 0x2c);
                      iVar75 = *(int *)(local_670.hit + 0x30);
                      iVar76 = *(int *)(local_670.hit + 0x34);
                      iVar77 = *(int *)(local_670.hit + 0x38);
                      iVar78 = *(int *)(local_670.hit + 0x3c);
                      bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar24 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar74 = *(int *)(local_670.hit + 0x4c);
                      iVar75 = *(int *)(local_670.hit + 0x50);
                      iVar76 = *(int *)(local_670.hit + 0x54);
                      iVar77 = *(int *)(local_670.hit + 0x58);
                      iVar78 = *(int *)(local_670.hit + 0x5c);
                      bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar24 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar74 = *(int *)(local_670.hit + 0x6c);
                      iVar75 = *(int *)(local_670.hit + 0x70);
                      iVar76 = *(int *)(local_670.hit + 0x74);
                      iVar77 = *(int *)(local_670.hit + 0x78);
                      iVar78 = *(int *)(local_670.hit + 0x7c);
                      bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar24 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar74 = *(int *)(local_670.hit + 0x8c);
                      iVar75 = *(int *)(local_670.hit + 0x90);
                      iVar76 = *(int *)(local_670.hit + 0x94);
                      iVar77 = *(int *)(local_670.hit + 0x98);
                      iVar78 = *(int *)(local_670.hit + 0x9c);
                      bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar24 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_670.ray + 0x21c);
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar109;
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar109;
                      local_540 = *(float *)(ray + k * 4 + 0x100);
                      fStack_53c = 0.0;
                      fStack_538 = 0.0;
                      fStack_534 = 0.0;
                    }
                    auVar104 = auVar230._0_32_;
                    bVar94 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & (byte)uVar92;
                    auVar164._4_4_ = local_540;
                    auVar164._0_4_ = local_540;
                    auVar164._8_4_ = local_540;
                    auVar164._12_4_ = local_540;
                    auVar164._16_4_ = local_540;
                    auVar164._20_4_ = local_540;
                    auVar164._24_4_ = local_540;
                    auVar164._28_4_ = local_540;
                    uVar26 = vcmpps_avx512vl(auVar221._0_32_,auVar164,2);
                    if ((bVar94 & (byte)uVar26) == 0) goto LAB_01a568b2;
                    bVar94 = bVar94 & (byte)uVar26;
                    uVar92 = (ulong)bVar94;
                    auVar165._8_4_ = 0x7f800000;
                    auVar165._0_8_ = 0x7f8000007f800000;
                    auVar165._12_4_ = 0x7f800000;
                    auVar165._16_4_ = 0x7f800000;
                    auVar165._20_4_ = 0x7f800000;
                    auVar165._24_4_ = 0x7f800000;
                    auVar165._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar165,auVar221._0_32_);
                    auVar145._0_4_ =
                         (uint)(bVar94 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar94 & 1) * 0x7f800000;
                    bVar18 = (bool)(bVar94 >> 1 & 1);
                    auVar145._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar94 >> 2 & 1);
                    auVar145._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar94 >> 3 & 1);
                    auVar145._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar94 >> 4 & 1);
                    auVar145._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar94 >> 5 & 1);
                    auVar145._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar94 >> 6 & 1);
                    auVar145._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar145._28_4_ =
                         (uint)(bVar94 >> 7) * auVar109._28_4_ |
                         (uint)!(bool)(bVar94 >> 7) * 0x7f800000;
                    auVar109 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar109 = vminps_avx(auVar145,auVar109);
                    auVar107 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    auVar107 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    uVar26 = vcmpps_avx512vl(auVar145,auVar109,0);
                    bVar85 = (byte)uVar26 & bVar94;
                    if (bVar85 != 0) {
                      bVar94 = bVar85;
                    }
                    uVar93 = 0;
                    for (uVar87 = (uint)bVar94; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000
                        ) {
                      uVar93 = uVar93 + 1;
                    }
                    uVar86 = (ulong)uVar93;
                  } while( true );
                }
                fVar171 = local_340[uVar86];
                uVar155 = *(undefined4 *)(local_320 + uVar86 * 4);
                fVar154 = 1.0 - fVar171;
                auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar154 + fVar154))),
                                          ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                auVar156 = ZEXT416((uint)fVar171);
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,
                                           ZEXT416(0xc0a00000));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                           ZEXT416((uint)(fVar171 + fVar171)),auVar101);
                auVar213 = ZEXT1664(auVar102);
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,
                                           ZEXT416(0x40000000));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154 * -3.0)),
                                           ZEXT416((uint)(fVar154 + fVar154)),auVar101);
                auVar156 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar156,
                                           ZEXT416((uint)(fVar154 * -2.0)));
                fVar154 = auVar8._0_4_ * 0.5;
                fVar166 = auVar102._0_4_ * 0.5;
                auVar201 = ZEXT464((uint)fVar166);
                fVar167 = auVar101._0_4_ * 0.5;
                fVar178 = auVar156._0_4_ * 0.5;
                auVar180._0_4_ = fVar178 * local_6d0;
                auVar180._4_4_ = fVar178 * fStack_6cc;
                auVar180._8_4_ = fVar178 * fStack_6c8;
                auVar180._12_4_ = fVar178 * fStack_6c4;
                auVar202._4_4_ = fVar167;
                auVar202._0_4_ = fVar167;
                auVar202._8_4_ = fVar167;
                auVar202._12_4_ = fVar167;
                auVar101 = vfmadd132ps_fma(auVar202,auVar180,*pauVar4);
                auVar211 = ZEXT1664(auVar101);
                auVar181._4_4_ = fVar166;
                auVar181._0_4_ = fVar166;
                auVar181._8_4_ = fVar166;
                auVar181._12_4_ = fVar166;
                auVar101 = vfmadd132ps_fma(auVar181,auVar101,*pauVar3);
                auVar172._4_4_ = fVar154;
                auVar172._0_4_ = fVar154;
                auVar172._8_4_ = fVar154;
                auVar172._12_4_ = fVar154;
                auVar101 = vfmadd213ps_fma(auVar172,auVar96,auVar101);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar86 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar101._0_4_;
                uVar16 = vextractps_avx(auVar101,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
                uVar16 = vextractps_avx(auVar101,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
                *(float *)(ray + k * 4 + 0x1e0) = fVar171;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar155;
                *(uint *)(ray + k * 4 + 0x220) = uVar14;
                *(uint *)(ray + k * 4 + 0x240) = uVar13;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01a568b2:
                fVar171 = (float)local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = fVar171;
    if (8 < iVar15) {
      auVar109 = vpbroadcastd_avx512vl();
      auVar230 = ZEXT3264(auVar109);
      local_540 = (float)local_640._0_4_;
      fStack_53c = (float)local_640._0_4_;
      fStack_538 = (float)local_640._0_4_;
      fStack_534 = (float)local_640._0_4_;
      fStack_530 = (float)local_640._0_4_;
      fStack_52c = (float)local_640._0_4_;
      fStack_528 = (float)local_640._0_4_;
      fStack_524 = (float)local_640._0_4_;
      uStack_51c = local_520;
      uStack_518 = local_520;
      uStack_514 = local_520;
      uStack_510 = local_520;
      uStack_50c = local_520;
      uStack_508 = local_520;
      uStack_504 = local_520;
      local_120 = 1.0 / (float)local_5a0._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar88 = 8;
      local_5e0 = auVar104;
LAB_01a5694c:
      if (lVar88 < iVar15) {
        auVar109 = vpbroadcastd_avx512vl();
        auVar109 = vpor_avx2(auVar109,_DAT_01fb4ba0);
        uVar27 = vpcmpgtd_avx512vl(auVar230._0_32_,auVar109);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar88 * 4 + lVar90);
        auVar107 = *(undefined1 (*) [32])(lVar90 + 0x22047f0 + lVar88 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar90 + 0x2204c74 + lVar88 * 4);
        auVar119 = *(undefined1 (*) [32])(lVar90 + 0x22050f8 + lVar88 * 4);
        auVar221._0_4_ = auVar119._0_4_ * (float)local_4e0._0_4_;
        auVar221._4_4_ = auVar119._4_4_ * (float)local_4e0._4_4_;
        auVar221._8_4_ = auVar119._8_4_ * fStack_4d8;
        auVar221._12_4_ = auVar119._12_4_ * fStack_4d4;
        auVar221._16_4_ = auVar119._16_4_ * fStack_4d0;
        auVar221._20_4_ = auVar119._20_4_ * fStack_4cc;
        auVar221._28_36_ = auVar211._28_36_;
        auVar221._24_4_ = auVar119._24_4_ * fStack_4c8;
        auVar211._0_4_ = auVar119._0_4_ * (float)local_500._0_4_;
        auVar211._4_4_ = auVar119._4_4_ * (float)local_500._4_4_;
        auVar211._8_4_ = auVar119._8_4_ * fStack_4f8;
        auVar211._12_4_ = auVar119._12_4_ * fStack_4f4;
        auVar211._16_4_ = auVar119._16_4_ * fStack_4f0;
        auVar211._20_4_ = auVar119._20_4_ * fStack_4ec;
        auVar211._28_36_ = auVar201._28_36_;
        auVar211._24_4_ = auVar119._24_4_ * fStack_4e8;
        auVar110 = vmulps_avx512vl(local_100,auVar119);
        auVar108 = vfmadd231ps_avx512vl(auVar221._0_32_,auVar120,local_4a0);
        auVar118 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar120,local_4c0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar120,local_e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_460);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar107,local_480);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar107,local_c0);
        auVar101 = vfmadd231ps_fma(auVar108,auVar109,local_420);
        auVar211 = ZEXT1664(auVar101);
        auVar102 = vfmadd231ps_fma(auVar118,auVar109,local_440);
        auVar201 = ZEXT1664(auVar102);
        auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar88 * 4 + lVar90);
        auVar108 = *(undefined1 (*) [32])(lVar90 + 0x2206c10 + lVar88 * 4);
        auVar114 = vfmadd231ps_avx512vl(auVar111,auVar109,local_a0);
        auVar118 = *(undefined1 (*) [32])(lVar90 + 0x2207094 + lVar88 * 4);
        auVar111 = *(undefined1 (*) [32])(lVar90 + 0x2207518 + lVar88 * 4);
        auVar214._0_4_ = auVar111._0_4_ * (float)local_4e0._0_4_;
        auVar214._4_4_ = auVar111._4_4_ * (float)local_4e0._4_4_;
        auVar214._8_4_ = auVar111._8_4_ * fStack_4d8;
        auVar214._12_4_ = auVar111._12_4_ * fStack_4d4;
        auVar214._16_4_ = auVar111._16_4_ * fStack_4d0;
        auVar214._20_4_ = auVar111._20_4_ * fStack_4cc;
        auVar214._28_36_ = auVar213._28_36_;
        auVar214._24_4_ = auVar111._24_4_ * fStack_4c8;
        auVar57._4_4_ = auVar111._4_4_ * (float)local_500._4_4_;
        auVar57._0_4_ = auVar111._0_4_ * (float)local_500._0_4_;
        auVar57._8_4_ = auVar111._8_4_ * fStack_4f8;
        auVar57._12_4_ = auVar111._12_4_ * fStack_4f4;
        auVar57._16_4_ = auVar111._16_4_ * fStack_4f0;
        auVar57._20_4_ = auVar111._20_4_ * fStack_4ec;
        auVar57._24_4_ = auVar111._24_4_ * fStack_4e8;
        auVar57._28_4_ = uStack_4e4;
        auVar112 = vmulps_avx512vl(local_100,auVar111);
        auVar113 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar118,local_4a0);
        auVar106 = vfmadd231ps_avx512vl(auVar57,auVar118,local_4c0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_e0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_460);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_c0);
        auVar156 = vfmadd231ps_fma(auVar113,auVar110,local_420);
        auVar213 = ZEXT1664(auVar156);
        auVar8 = vfmadd231ps_fma(auVar106,auVar110,local_440);
        auVar106 = vfmadd231ps_avx512vl(auVar112,auVar110,local_a0);
        auVar104 = vmaxps_avx512vl(auVar114,auVar106);
        auVar112 = vsubps_avx(ZEXT1632(auVar156),ZEXT1632(auVar101));
        auVar113 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar102));
        auVar105 = vmulps_avx512vl(ZEXT1632(auVar102),auVar112);
        auVar115 = vmulps_avx512vl(ZEXT1632(auVar101),auVar113);
        auVar105 = vsubps_avx512vl(auVar105,auVar115);
        auVar115 = vmulps_avx512vl(auVar113,auVar113);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar115);
        auVar105 = vmulps_avx512vl(auVar105,auVar105);
        uVar26 = vcmpps_avx512vl(auVar105,auVar104,2);
        bVar94 = (byte)uVar27 & (byte)uVar26;
        if (bVar94 != 0) {
          auVar111 = vmulps_avx512vl(local_280,auVar111);
          auVar118 = vfmadd213ps_avx512vl(auVar118,local_5e0,auVar111);
          local_580 = auVar233._0_32_;
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_580,auVar118);
          local_560 = auVar231._0_32_;
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_560,auVar108);
          auVar119 = vmulps_avx512vl(local_280,auVar119);
          auVar120 = vfmadd213ps_avx512vl(auVar120,local_5e0,auVar119);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_580,auVar120);
          auVar108 = vfmadd213ps_avx512vl(auVar109,local_560,auVar107);
          auVar109 = *(undefined1 (*) [32])(lVar90 + 0x220557c + lVar88 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar90 + 0x2205a00 + lVar88 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar90 + 0x2205e84 + lVar88 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar90 + 0x2206308 + lVar88 * 4);
          auVar118 = vmulps_avx512vl(_local_4e0,auVar119);
          auVar111 = vmulps_avx512vl(_local_500,auVar119);
          auVar119 = vmulps_avx512vl(local_280,auVar119);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar120,local_4a0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar120,local_4c0);
          auVar100 = vfmadd231ps_fma(auVar119,auVar120,local_5e0);
          auVar120 = vfmadd231ps_avx512vl(auVar118,auVar107,local_460);
          auVar119 = vfmadd231ps_avx512vl(auVar111,auVar107,local_480);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),local_580,auVar107);
          auVar118 = vfmadd231ps_avx512vl(auVar120,auVar109,local_420);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar109,local_440);
          auVar111 = vfmadd231ps_avx512vl(auVar107,local_560,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar90 + 0x220799c + lVar88 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar90 + 0x22082a4 + lVar88 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar90 + 0x2208728 + lVar88 * 4);
          auVar104 = vmulps_avx512vl(_local_4e0,auVar120);
          auVar105 = vmulps_avx512vl(_local_500,auVar120);
          auVar120 = vmulps_avx512vl(local_280,auVar120);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_4a0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_4c0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,local_5e0,auVar107);
          auVar107 = *(undefined1 (*) [32])(lVar90 + 0x2207e20 + lVar88 * 4);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_460);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_480);
          auVar107 = vfmadd231ps_avx512vl(auVar120,local_580,auVar107);
          auVar120 = vfmadd231ps_avx512vl(auVar104,auVar109,local_420);
          auVar104 = vfmadd231ps_avx512vl(auVar105,auVar109,local_440);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_560,auVar109);
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar118,auVar105);
          vandps_avx512vl(auVar119,auVar105);
          auVar109 = vmaxps_avx(auVar105,auVar105);
          vandps_avx512vl(auVar111,auVar105);
          auVar109 = vmaxps_avx(auVar109,auVar105);
          auVar83._4_4_ = fStack_53c;
          auVar83._0_4_ = local_540;
          auVar83._8_4_ = fStack_538;
          auVar83._12_4_ = fStack_534;
          auVar83._16_4_ = fStack_530;
          auVar83._20_4_ = fStack_52c;
          auVar83._24_4_ = fStack_528;
          auVar83._28_4_ = fStack_524;
          uVar86 = vcmpps_avx512vl(auVar109,auVar83,1);
          bVar18 = (bool)((byte)uVar86 & 1);
          auVar133._0_4_ = (float)((uint)bVar18 * auVar112._0_4_ | (uint)!bVar18 * auVar118._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar18 * auVar112._4_4_ | (uint)!bVar18 * auVar118._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar18 * auVar112._8_4_ | (uint)!bVar18 * auVar118._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar133._12_4_ =
               (float)((uint)bVar18 * auVar112._12_4_ | (uint)!bVar18 * auVar118._12_4_);
          bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar133._16_4_ =
               (float)((uint)bVar18 * auVar112._16_4_ | (uint)!bVar18 * auVar118._16_4_);
          bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar133._20_4_ =
               (float)((uint)bVar18 * auVar112._20_4_ | (uint)!bVar18 * auVar118._20_4_);
          bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar133._24_4_ =
               (float)((uint)bVar18 * auVar112._24_4_ | (uint)!bVar18 * auVar118._24_4_);
          bVar18 = SUB81(uVar86 >> 7,0);
          auVar133._28_4_ = (uint)bVar18 * auVar112._28_4_ | (uint)!bVar18 * auVar118._28_4_;
          bVar18 = (bool)((byte)uVar86 & 1);
          auVar134._0_4_ = (float)((uint)bVar18 * auVar113._0_4_ | (uint)!bVar18 * auVar119._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar119._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar119._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar134._12_4_ =
               (float)((uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar119._12_4_);
          bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar134._16_4_ =
               (float)((uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * auVar119._16_4_);
          bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar134._20_4_ =
               (float)((uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * auVar119._20_4_);
          bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar134._24_4_ =
               (float)((uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * auVar119._24_4_);
          bVar18 = SUB81(uVar86 >> 7,0);
          auVar134._28_4_ = (uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar119._28_4_;
          vandps_avx512vl(auVar120,auVar105);
          vandps_avx512vl(auVar104,auVar105);
          auVar109 = vmaxps_avx(auVar134,auVar134);
          vandps_avx512vl(auVar107,auVar105);
          auVar109 = vmaxps_avx(auVar109,auVar134);
          uVar86 = vcmpps_avx512vl(auVar109,auVar83,1);
          bVar18 = (bool)((byte)uVar86 & 1);
          auVar135._0_4_ = (uint)bVar18 * auVar112._0_4_ | (uint)!bVar18 * auVar120._0_4_;
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar18 * auVar112._4_4_ | (uint)!bVar18 * auVar120._4_4_;
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar18 * auVar112._8_4_ | (uint)!bVar18 * auVar120._8_4_;
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar18 * auVar112._12_4_ | (uint)!bVar18 * auVar120._12_4_;
          bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar135._16_4_ = (uint)bVar18 * auVar112._16_4_ | (uint)!bVar18 * auVar120._16_4_;
          bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar135._20_4_ = (uint)bVar18 * auVar112._20_4_ | (uint)!bVar18 * auVar120._20_4_;
          bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar135._24_4_ = (uint)bVar18 * auVar112._24_4_ | (uint)!bVar18 * auVar120._24_4_;
          bVar18 = SUB81(uVar86 >> 7,0);
          auVar135._28_4_ = (uint)bVar18 * auVar112._28_4_ | (uint)!bVar18 * auVar120._28_4_;
          bVar18 = (bool)((byte)uVar86 & 1);
          auVar136._0_4_ = (float)((uint)bVar18 * auVar113._0_4_ | (uint)!bVar18 * auVar104._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar104._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar104._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar104._12_4_);
          bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * auVar104._16_4_);
          bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * auVar104._20_4_);
          bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * auVar104._24_4_);
          bVar18 = SUB81(uVar86 >> 7,0);
          auVar136._28_4_ = (uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar104._28_4_;
          auVar219._8_4_ = 0x80000000;
          auVar219._0_8_ = 0x8000000080000000;
          auVar219._12_4_ = 0x80000000;
          auVar219._16_4_ = 0x80000000;
          auVar219._20_4_ = 0x80000000;
          auVar219._24_4_ = 0x80000000;
          auVar219._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar135,auVar219);
          auVar103 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
          auVar107 = vfmadd213ps_avx512vl(auVar133,auVar133,ZEXT1632(auVar103));
          auVar100 = vfmadd231ps_fma(auVar107,auVar134,auVar134);
          auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
          auVar229._8_4_ = 0xbf000000;
          auVar229._0_8_ = 0xbf000000bf000000;
          auVar229._12_4_ = 0xbf000000;
          auVar229._16_4_ = 0xbf000000;
          auVar229._20_4_ = 0xbf000000;
          auVar229._24_4_ = 0xbf000000;
          auVar229._28_4_ = 0xbf000000;
          fVar171 = auVar107._0_4_;
          fVar154 = auVar107._4_4_;
          fVar166 = auVar107._8_4_;
          fVar167 = auVar107._12_4_;
          fVar178 = auVar107._16_4_;
          fVar177 = auVar107._20_4_;
          fVar192 = auVar107._24_4_;
          auVar58._4_4_ = fVar154 * fVar154 * fVar154 * auVar100._4_4_ * -0.5;
          auVar58._0_4_ = fVar171 * fVar171 * fVar171 * auVar100._0_4_ * -0.5;
          auVar58._8_4_ = fVar166 * fVar166 * fVar166 * auVar100._8_4_ * -0.5;
          auVar58._12_4_ = fVar167 * fVar167 * fVar167 * auVar100._12_4_ * -0.5;
          auVar58._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar58._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar58._24_4_ = fVar192 * fVar192 * fVar192 * -0.0;
          auVar58._28_4_ = auVar134._28_4_;
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar107 = vfmadd231ps_avx512vl(auVar58,auVar120,auVar107);
          auVar59._4_4_ = auVar134._4_4_ * auVar107._4_4_;
          auVar59._0_4_ = auVar134._0_4_ * auVar107._0_4_;
          auVar59._8_4_ = auVar134._8_4_ * auVar107._8_4_;
          auVar59._12_4_ = auVar134._12_4_ * auVar107._12_4_;
          auVar59._16_4_ = auVar134._16_4_ * auVar107._16_4_;
          auVar59._20_4_ = auVar134._20_4_ * auVar107._20_4_;
          auVar59._24_4_ = auVar134._24_4_ * auVar107._24_4_;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = auVar107._4_4_ * -auVar133._4_4_;
          auVar60._0_4_ = auVar107._0_4_ * -auVar133._0_4_;
          auVar60._8_4_ = auVar107._8_4_ * -auVar133._8_4_;
          auVar60._12_4_ = auVar107._12_4_ * -auVar133._12_4_;
          auVar60._16_4_ = auVar107._16_4_ * -auVar133._16_4_;
          auVar60._20_4_ = auVar107._20_4_ * -auVar133._20_4_;
          auVar60._24_4_ = auVar107._24_4_ * -auVar133._24_4_;
          auVar60._28_4_ = auVar134._28_4_;
          auVar119 = vmulps_avx512vl(auVar107,ZEXT1632(auVar103));
          auVar111 = ZEXT1632(auVar103);
          auVar107 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar111);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar136,auVar136);
          auVar118 = vrsqrt14ps_avx512vl(auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar229);
          fVar171 = auVar118._0_4_;
          fVar154 = auVar118._4_4_;
          fVar166 = auVar118._8_4_;
          fVar167 = auVar118._12_4_;
          fVar178 = auVar118._16_4_;
          fVar177 = auVar118._20_4_;
          fVar192 = auVar118._24_4_;
          auVar61._4_4_ = fVar154 * fVar154 * fVar154 * auVar107._4_4_;
          auVar61._0_4_ = fVar171 * fVar171 * fVar171 * auVar107._0_4_;
          auVar61._8_4_ = fVar166 * fVar166 * fVar166 * auVar107._8_4_;
          auVar61._12_4_ = fVar167 * fVar167 * fVar167 * auVar107._12_4_;
          auVar61._16_4_ = fVar178 * fVar178 * fVar178 * auVar107._16_4_;
          auVar61._20_4_ = fVar177 * fVar177 * fVar177 * auVar107._20_4_;
          auVar61._24_4_ = fVar192 * fVar192 * fVar192 * auVar107._24_4_;
          auVar61._28_4_ = auVar107._28_4_;
          auVar107 = vfmadd231ps_avx512vl(auVar61,auVar120,auVar118);
          auVar62._4_4_ = auVar136._4_4_ * auVar107._4_4_;
          auVar62._0_4_ = auVar136._0_4_ * auVar107._0_4_;
          auVar62._8_4_ = auVar136._8_4_ * auVar107._8_4_;
          auVar62._12_4_ = auVar136._12_4_ * auVar107._12_4_;
          auVar62._16_4_ = auVar136._16_4_ * auVar107._16_4_;
          auVar62._20_4_ = auVar136._20_4_ * auVar107._20_4_;
          auVar62._24_4_ = auVar136._24_4_ * auVar107._24_4_;
          auVar62._28_4_ = auVar118._28_4_;
          auVar63._4_4_ = auVar107._4_4_ * auVar109._4_4_;
          auVar63._0_4_ = auVar107._0_4_ * auVar109._0_4_;
          auVar63._8_4_ = auVar107._8_4_ * auVar109._8_4_;
          auVar63._12_4_ = auVar107._12_4_ * auVar109._12_4_;
          auVar63._16_4_ = auVar107._16_4_ * auVar109._16_4_;
          auVar63._20_4_ = auVar107._20_4_ * auVar109._20_4_;
          auVar63._24_4_ = auVar107._24_4_ * auVar109._24_4_;
          auVar63._28_4_ = auVar109._28_4_;
          auVar109 = vmulps_avx512vl(auVar107,auVar111);
          auVar100 = vfmadd213ps_fma(auVar59,auVar114,ZEXT1632(auVar101));
          auVar186 = vfmadd213ps_fma(auVar60,auVar114,ZEXT1632(auVar102));
          auVar120 = vfmadd213ps_avx512vl(auVar119,auVar114,auVar108);
          auVar118 = vfmadd213ps_avx512vl(auVar62,auVar106,ZEXT1632(auVar156));
          auVar99 = vfnmadd213ps_fma(auVar59,auVar114,ZEXT1632(auVar101));
          auVar101 = vfmadd213ps_fma(auVar63,auVar106,ZEXT1632(auVar8));
          auVar97 = vfnmadd213ps_fma(auVar60,auVar114,ZEXT1632(auVar102));
          auVar102 = vfmadd213ps_fma(auVar109,auVar106,auVar110);
          auVar30 = vfnmadd231ps_fma(auVar108,auVar114,auVar119);
          auVar215 = vfnmadd213ps_fma(auVar62,auVar106,ZEXT1632(auVar156));
          auVar217 = vfnmadd213ps_fma(auVar63,auVar106,ZEXT1632(auVar8));
          auVar98 = vfnmadd231ps_fma(auVar110,auVar106,auVar109);
          auVar110 = vsubps_avx512vl(auVar118,ZEXT1632(auVar99));
          auVar109 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar97));
          auVar107 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar30));
          auVar64._4_4_ = auVar109._4_4_ * auVar30._4_4_;
          auVar64._0_4_ = auVar109._0_4_ * auVar30._0_4_;
          auVar64._8_4_ = auVar109._8_4_ * auVar30._8_4_;
          auVar64._12_4_ = auVar109._12_4_ * auVar30._12_4_;
          auVar64._16_4_ = auVar109._16_4_ * 0.0;
          auVar64._20_4_ = auVar109._20_4_ * 0.0;
          auVar64._24_4_ = auVar109._24_4_ * 0.0;
          auVar64._28_4_ = auVar119._28_4_;
          auVar156 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar97),auVar107);
          auVar65._4_4_ = auVar107._4_4_ * auVar99._4_4_;
          auVar65._0_4_ = auVar107._0_4_ * auVar99._0_4_;
          auVar65._8_4_ = auVar107._8_4_ * auVar99._8_4_;
          auVar65._12_4_ = auVar107._12_4_ * auVar99._12_4_;
          auVar65._16_4_ = auVar107._16_4_ * 0.0;
          auVar65._20_4_ = auVar107._20_4_ * 0.0;
          auVar65._24_4_ = auVar107._24_4_ * 0.0;
          auVar65._28_4_ = auVar107._28_4_;
          auVar8 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar30),auVar110);
          auVar66._4_4_ = auVar97._4_4_ * auVar110._4_4_;
          auVar66._0_4_ = auVar97._0_4_ * auVar110._0_4_;
          auVar66._8_4_ = auVar97._8_4_ * auVar110._8_4_;
          auVar66._12_4_ = auVar97._12_4_ * auVar110._12_4_;
          auVar66._16_4_ = auVar110._16_4_ * 0.0;
          auVar66._20_4_ = auVar110._20_4_ * 0.0;
          auVar66._24_4_ = auVar110._24_4_ * 0.0;
          auVar66._28_4_ = auVar110._28_4_;
          auVar169 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar99),auVar109);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar169),auVar111,ZEXT1632(auVar8));
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,ZEXT1632(auVar156));
          auVar105 = ZEXT1632(auVar103);
          uVar86 = vcmpps_avx512vl(auVar109,auVar105,2);
          bVar85 = (byte)uVar86;
          fVar146 = (float)((uint)(bVar85 & 1) * auVar100._0_4_ |
                           (uint)!(bool)(bVar85 & 1) * auVar215._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          fVar148 = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar215._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          fVar150 = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar215._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          fVar152 = (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar215._12_4_);
          auVar111 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar146))));
          fVar147 = (float)((uint)(bVar85 & 1) * auVar186._0_4_ |
                           (uint)!(bool)(bVar85 & 1) * auVar217._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          fVar149 = (float)((uint)bVar18 * auVar186._4_4_ | (uint)!bVar18 * auVar217._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          fVar151 = (float)((uint)bVar18 * auVar186._8_4_ | (uint)!bVar18 * auVar217._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          fVar153 = (float)((uint)bVar18 * auVar186._12_4_ | (uint)!bVar18 * auVar217._12_4_);
          auVar112 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar147))));
          auVar137._0_4_ =
               (float)((uint)(bVar85 & 1) * auVar120._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar98._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * auVar98._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * auVar98._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar137._12_4_ = (float)((uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * auVar98._12_4_)
          ;
          fVar171 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar120._16_4_);
          auVar137._16_4_ = fVar171;
          fVar154 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar120._20_4_);
          auVar137._20_4_ = fVar154;
          fVar166 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar120._24_4_);
          auVar137._24_4_ = fVar166;
          iVar1 = (uint)(byte)(uVar86 >> 7) * auVar120._28_4_;
          auVar137._28_4_ = iVar1;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar99),auVar118);
          auVar138._0_4_ =
               (uint)(bVar85 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar156._0_4_;
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar156._4_4_;
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar156._8_4_;
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar156._12_4_;
          auVar138._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar109._16_4_;
          auVar138._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar109._20_4_;
          auVar138._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar109._24_4_;
          auVar138._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar101));
          auVar139._0_4_ =
               (float)((uint)(bVar85 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar100._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar100._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar100._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar100._12_4_);
          fVar167 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar109._16_4_);
          auVar139._16_4_ = fVar167;
          fVar178 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar109._20_4_);
          auVar139._20_4_ = fVar178;
          fVar177 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar109._24_4_);
          auVar139._24_4_ = fVar177;
          auVar139._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar30),ZEXT1632(auVar102));
          auVar140._0_4_ =
               (float)((uint)(bVar85 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar186._0_4_);
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar186._4_4_);
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar186._8_4_);
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar186._12_4_);
          fVar192 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar109._16_4_);
          auVar140._16_4_ = fVar192;
          fVar176 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar109._20_4_);
          auVar140._20_4_ = fVar176;
          fVar95 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar109._24_4_);
          auVar140._24_4_ = fVar95;
          iVar2 = (uint)(byte)(uVar86 >> 7) * auVar109._28_4_;
          auVar140._28_4_ = iVar2;
          auVar141._0_4_ =
               (uint)(bVar85 & 1) * (int)auVar99._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar118._0_4_;
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar18 * (int)auVar99._4_4_ | (uint)!bVar18 * auVar118._4_4_;
          bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar18 * (int)auVar99._8_4_ | (uint)!bVar18 * auVar118._8_4_;
          bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar18 * (int)auVar99._12_4_ | (uint)!bVar18 * auVar118._12_4_;
          auVar141._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar118._16_4_;
          auVar141._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar118._20_4_;
          auVar141._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar118._24_4_;
          auVar141._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar118._28_4_;
          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar86 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar86 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar86 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar86 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar118 = vsubps_avx512vl(auVar141,auVar111);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar97._12_4_ |
                                                   (uint)!bVar22 * auVar101._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar97._8_4_ |
                                                            (uint)!bVar20 * auVar101._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar97._4_4_ |
                                                                     (uint)!bVar18 * auVar101._4_4_,
                                                                     (uint)(bVar85 & 1) *
                                                                     (int)auVar97._0_4_ |
                                                                     (uint)!(bool)(bVar85 & 1) *
                                                                     auVar101._0_4_)))),auVar112);
          auVar211 = ZEXT3264(auVar107);
          auVar120 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar30._12_4_ |
                                                   (uint)!bVar23 * auVar102._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar30._8_4_ |
                                                            (uint)!bVar21 * auVar102._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar30._4_4_ |
                                                                     (uint)!bVar19 * auVar102._4_4_,
                                                                     (uint)(bVar85 & 1) *
                                                                     (int)auVar30._0_4_ |
                                                                     (uint)!(bool)(bVar85 & 1) *
                                                                     auVar102._0_4_)))),auVar137);
          auVar119 = vsubps_avx(auVar111,auVar138);
          auVar213 = ZEXT3264(auVar119);
          auVar110 = vsubps_avx(auVar112,auVar139);
          auVar108 = vsubps_avx(auVar137,auVar140);
          auVar67._4_4_ = auVar120._4_4_ * fVar148;
          auVar67._0_4_ = auVar120._0_4_ * fVar146;
          auVar67._8_4_ = auVar120._8_4_ * fVar150;
          auVar67._12_4_ = auVar120._12_4_ * fVar152;
          auVar67._16_4_ = auVar120._16_4_ * 0.0;
          auVar67._20_4_ = auVar120._20_4_ * 0.0;
          auVar67._24_4_ = auVar120._24_4_ * 0.0;
          auVar67._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar67,auVar137,auVar118);
          auVar190._0_4_ = fVar147 * auVar118._0_4_;
          auVar190._4_4_ = fVar149 * auVar118._4_4_;
          auVar190._8_4_ = fVar151 * auVar118._8_4_;
          auVar190._12_4_ = fVar153 * auVar118._12_4_;
          auVar190._16_4_ = auVar118._16_4_ * 0.0;
          auVar190._20_4_ = auVar118._20_4_ * 0.0;
          auVar190._24_4_ = auVar118._24_4_ * 0.0;
          auVar190._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar190,auVar111,auVar107);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar105,ZEXT1632(auVar101));
          auVar197._0_4_ = auVar107._0_4_ * auVar137._0_4_;
          auVar197._4_4_ = auVar107._4_4_ * auVar137._4_4_;
          auVar197._8_4_ = auVar107._8_4_ * auVar137._8_4_;
          auVar197._12_4_ = auVar107._12_4_ * auVar137._12_4_;
          auVar197._16_4_ = auVar107._16_4_ * fVar171;
          auVar197._20_4_ = auVar107._20_4_ * fVar154;
          auVar197._24_4_ = auVar107._24_4_ * fVar166;
          auVar197._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar197,auVar112,auVar120);
          auVar113 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar101));
          auVar109 = vmulps_avx512vl(auVar108,auVar138);
          auVar109 = vfmsub231ps_avx512vl(auVar109,auVar119,auVar140);
          auVar68._4_4_ = auVar110._4_4_ * auVar140._4_4_;
          auVar68._0_4_ = auVar110._0_4_ * auVar140._0_4_;
          auVar68._8_4_ = auVar110._8_4_ * auVar140._8_4_;
          auVar68._12_4_ = auVar110._12_4_ * auVar140._12_4_;
          auVar68._16_4_ = auVar110._16_4_ * fVar192;
          auVar68._20_4_ = auVar110._20_4_ * fVar176;
          auVar68._24_4_ = auVar110._24_4_ * fVar95;
          auVar68._28_4_ = iVar2;
          auVar101 = vfmsub231ps_fma(auVar68,auVar139,auVar108);
          auVar198._0_4_ = auVar139._0_4_ * auVar119._0_4_;
          auVar198._4_4_ = auVar139._4_4_ * auVar119._4_4_;
          auVar198._8_4_ = auVar139._8_4_ * auVar119._8_4_;
          auVar198._12_4_ = auVar139._12_4_ * auVar119._12_4_;
          auVar198._16_4_ = fVar167 * auVar119._16_4_;
          auVar198._20_4_ = fVar178 * auVar119._20_4_;
          auVar198._24_4_ = fVar177 * auVar119._24_4_;
          auVar198._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar198,auVar110,auVar138);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar105,auVar109);
          auVar104 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar101));
          auVar201 = ZEXT3264(auVar104);
          auVar109 = vmaxps_avx(auVar113,auVar104);
          uVar26 = vcmpps_avx512vl(auVar109,auVar105,2);
          bVar94 = bVar94 & (byte)uVar26;
          if (bVar94 != 0) {
            auVar69._4_4_ = auVar108._4_4_ * auVar107._4_4_;
            auVar69._0_4_ = auVar108._0_4_ * auVar107._0_4_;
            auVar69._8_4_ = auVar108._8_4_ * auVar107._8_4_;
            auVar69._12_4_ = auVar108._12_4_ * auVar107._12_4_;
            auVar69._16_4_ = auVar108._16_4_ * auVar107._16_4_;
            auVar69._20_4_ = auVar108._20_4_ * auVar107._20_4_;
            auVar69._24_4_ = auVar108._24_4_ * auVar107._24_4_;
            auVar69._28_4_ = auVar109._28_4_;
            auVar8 = vfmsub231ps_fma(auVar69,auVar110,auVar120);
            auVar70._4_4_ = auVar120._4_4_ * auVar119._4_4_;
            auVar70._0_4_ = auVar120._0_4_ * auVar119._0_4_;
            auVar70._8_4_ = auVar120._8_4_ * auVar119._8_4_;
            auVar70._12_4_ = auVar120._12_4_ * auVar119._12_4_;
            auVar70._16_4_ = auVar120._16_4_ * auVar119._16_4_;
            auVar70._20_4_ = auVar120._20_4_ * auVar119._20_4_;
            auVar70._24_4_ = auVar120._24_4_ * auVar119._24_4_;
            auVar70._28_4_ = auVar120._28_4_;
            auVar156 = vfmsub231ps_fma(auVar70,auVar118,auVar108);
            auVar71._4_4_ = auVar110._4_4_ * auVar118._4_4_;
            auVar71._0_4_ = auVar110._0_4_ * auVar118._0_4_;
            auVar71._8_4_ = auVar110._8_4_ * auVar118._8_4_;
            auVar71._12_4_ = auVar110._12_4_ * auVar118._12_4_;
            auVar71._16_4_ = auVar110._16_4_ * auVar118._16_4_;
            auVar71._20_4_ = auVar110._20_4_ * auVar118._20_4_;
            auVar71._24_4_ = auVar110._24_4_ * auVar118._24_4_;
            auVar71._28_4_ = auVar110._28_4_;
            auVar100 = vfmsub231ps_fma(auVar71,auVar119,auVar107);
            auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar156),ZEXT1632(auVar100));
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar8),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar102));
            auVar213 = ZEXT3264(auVar109);
            auVar36._8_4_ = 0x3f800000;
            auVar36._0_8_ = 0x3f8000003f800000;
            auVar36._12_4_ = 0x3f800000;
            auVar36._16_4_ = 0x3f800000;
            auVar36._20_4_ = 0x3f800000;
            auVar36._24_4_ = 0x3f800000;
            auVar36._28_4_ = 0x3f800000;
            auVar107 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar102),auVar36);
            auVar101 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
            auVar211 = ZEXT1664(auVar101);
            auVar72._4_4_ = auVar100._4_4_ * auVar137._4_4_;
            auVar72._0_4_ = auVar100._0_4_ * auVar137._0_4_;
            auVar72._8_4_ = auVar100._8_4_ * auVar137._8_4_;
            auVar72._12_4_ = auVar100._12_4_ * auVar137._12_4_;
            auVar72._16_4_ = fVar171 * 0.0;
            auVar72._20_4_ = fVar154 * 0.0;
            auVar72._24_4_ = fVar166 * 0.0;
            auVar72._28_4_ = iVar1;
            auVar156 = vfmadd231ps_fma(auVar72,auVar112,ZEXT1632(auVar156));
            auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar111,ZEXT1632(auVar8));
            fVar171 = auVar101._0_4_;
            fVar154 = auVar101._4_4_;
            fVar166 = auVar101._8_4_;
            fVar167 = auVar101._12_4_;
            local_3c0 = ZEXT1632(CONCAT412(auVar156._12_4_ * fVar167,
                                           CONCAT48(auVar156._8_4_ * fVar166,
                                                    CONCAT44(auVar156._4_4_ * fVar154,
                                                             auVar156._0_4_ * fVar171))));
            auVar221 = ZEXT3264(local_3c0);
            auVar84._4_4_ = uStack_51c;
            auVar84._0_4_ = local_520;
            auVar84._8_4_ = uStack_518;
            auVar84._12_4_ = uStack_514;
            auVar84._16_4_ = uStack_510;
            auVar84._20_4_ = uStack_50c;
            auVar84._24_4_ = uStack_508;
            auVar84._28_4_ = uStack_504;
            uVar26 = vcmpps_avx512vl(local_3c0,auVar84,0xd);
            uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar37._4_4_ = uVar155;
            auVar37._0_4_ = uVar155;
            auVar37._8_4_ = uVar155;
            auVar37._12_4_ = uVar155;
            auVar37._16_4_ = uVar155;
            auVar37._20_4_ = uVar155;
            auVar37._24_4_ = uVar155;
            auVar37._28_4_ = uVar155;
            uVar27 = vcmpps_avx512vl(local_3c0,auVar37,2);
            bVar94 = (byte)uVar26 & (byte)uVar27 & bVar94;
            if (bVar94 != 0) {
              uVar92 = vcmpps_avx512vl(ZEXT1632(auVar102),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar92 = bVar94 & uVar92;
              if ((char)uVar92 != '\0') {
                fVar178 = auVar113._0_4_ * fVar171;
                fVar177 = auVar113._4_4_ * fVar154;
                auVar73._4_4_ = fVar177;
                auVar73._0_4_ = fVar178;
                fVar192 = auVar113._8_4_ * fVar166;
                auVar73._8_4_ = fVar192;
                fVar95 = auVar113._12_4_ * fVar167;
                auVar73._12_4_ = fVar95;
                fVar176 = auVar113._16_4_ * 0.0;
                auVar73._16_4_ = fVar176;
                fVar146 = auVar113._20_4_ * 0.0;
                auVar73._20_4_ = fVar146;
                fVar147 = auVar113._24_4_ * 0.0;
                auVar73._24_4_ = fVar147;
                auVar73._28_4_ = auVar113._28_4_;
                auVar175._8_4_ = 0x3f800000;
                auVar175._0_8_ = 0x3f8000003f800000;
                auVar175._12_4_ = 0x3f800000;
                auVar175._16_4_ = 0x3f800000;
                auVar175._20_4_ = 0x3f800000;
                auVar175._24_4_ = 0x3f800000;
                auVar175._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar175,auVar73);
                local_400._0_4_ =
                     (float)((uint)(bVar85 & 1) * (int)fVar178 |
                            (uint)!(bool)(bVar85 & 1) * auVar109._0_4_);
                bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar109._4_4_);
                bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar18 * (int)fVar192 | (uint)!bVar18 * auVar109._8_4_);
                bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar18 * (int)fVar95 | (uint)!bVar18 * auVar109._12_4_);
                bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar18 * (int)fVar176 | (uint)!bVar18 * auVar109._16_4_);
                bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar109._20_4_);
                bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar109._24_4_);
                bVar18 = SUB81(uVar86 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar109._28_4_);
                auVar109 = vsubps_avx(auVar106,auVar114);
                auVar101 = vfmadd213ps_fma(auVar109,local_400,auVar114);
                uVar155 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar38._4_4_ = uVar155;
                auVar38._0_4_ = uVar155;
                auVar38._8_4_ = uVar155;
                auVar38._12_4_ = uVar155;
                auVar38._16_4_ = uVar155;
                auVar38._20_4_ = uVar155;
                auVar38._24_4_ = uVar155;
                auVar38._28_4_ = uVar155;
                auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar101._12_4_ + auVar101._12_4_,
                                                              CONCAT48(auVar101._8_4_ +
                                                                       auVar101._8_4_,
                                                                       CONCAT44(auVar101._4_4_ +
                                                                                auVar101._4_4_,
                                                                                auVar101._0_4_ +
                                                                                auVar101._0_4_)))),
                                           auVar38);
                uVar28 = vcmpps_avx512vl(local_3c0,auVar109,6);
                uVar92 = uVar92 & uVar28;
                bVar94 = (byte)uVar92;
                if (bVar94 != 0) {
                  auVar170._0_4_ = auVar104._0_4_ * fVar171;
                  auVar170._4_4_ = auVar104._4_4_ * fVar154;
                  auVar170._8_4_ = auVar104._8_4_ * fVar166;
                  auVar170._12_4_ = auVar104._12_4_ * fVar167;
                  auVar170._16_4_ = auVar104._16_4_ * 0.0;
                  auVar170._20_4_ = auVar104._20_4_ * 0.0;
                  auVar170._24_4_ = auVar104._24_4_ * 0.0;
                  auVar170._28_4_ = 0;
                  auVar191._8_4_ = 0x3f800000;
                  auVar191._0_8_ = 0x3f8000003f800000;
                  auVar191._12_4_ = 0x3f800000;
                  auVar191._16_4_ = 0x3f800000;
                  auVar191._20_4_ = 0x3f800000;
                  auVar191._24_4_ = 0x3f800000;
                  auVar191._28_4_ = 0x3f800000;
                  auVar109 = vsubps_avx(auVar191,auVar170);
                  auVar142._0_4_ =
                       (uint)(bVar85 & 1) * (int)auVar170._0_4_ |
                       (uint)!(bool)(bVar85 & 1) * auVar109._0_4_;
                  bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                  auVar142._4_4_ =
                       (uint)bVar18 * (int)auVar170._4_4_ | (uint)!bVar18 * auVar109._4_4_;
                  bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
                  auVar142._8_4_ =
                       (uint)bVar18 * (int)auVar170._8_4_ | (uint)!bVar18 * auVar109._8_4_;
                  bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
                  auVar142._12_4_ =
                       (uint)bVar18 * (int)auVar170._12_4_ | (uint)!bVar18 * auVar109._12_4_;
                  bVar18 = (bool)((byte)(uVar86 >> 4) & 1);
                  auVar142._16_4_ =
                       (uint)bVar18 * (int)auVar170._16_4_ | (uint)!bVar18 * auVar109._16_4_;
                  bVar18 = (bool)((byte)(uVar86 >> 5) & 1);
                  auVar142._20_4_ =
                       (uint)bVar18 * (int)auVar170._20_4_ | (uint)!bVar18 * auVar109._20_4_;
                  bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
                  auVar142._24_4_ =
                       (uint)bVar18 * (int)auVar170._24_4_ | (uint)!bVar18 * auVar109._24_4_;
                  auVar142._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar109._28_4_;
                  auVar39._8_4_ = 0x40000000;
                  auVar39._0_8_ = 0x4000000040000000;
                  auVar39._12_4_ = 0x40000000;
                  auVar39._16_4_ = 0x40000000;
                  auVar39._20_4_ = 0x40000000;
                  auVar39._24_4_ = 0x40000000;
                  auVar39._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar142,auVar191,auVar39);
                  local_3a0 = (undefined4)lVar88;
                  pGVar89 = (context->scene->geometries).items[uVar13].ptr;
                  if ((pGVar89->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    uVar93 = (uint)uVar92;
                    auVar101 = vcvtsi2ss_avx512f(auVar103,local_3a0);
                    fVar171 = auVar101._0_4_;
                    local_340[0] = (fVar171 + local_400._0_4_ + 0.0) * local_120;
                    local_340[1] = (fVar171 + local_400._4_4_ + 1.0) * fStack_11c;
                    local_340[2] = (fVar171 + local_400._8_4_ + 2.0) * fStack_118;
                    local_340[3] = (fVar171 + local_400._12_4_ + 3.0) * fStack_114;
                    fStack_330 = (fVar171 + local_400._16_4_ + 4.0) * fStack_110;
                    fStack_32c = (fVar171 + local_400._20_4_ + 5.0) * fStack_10c;
                    fStack_328 = (fVar171 + local_400._24_4_ + 6.0) * fStack_108;
                    fStack_324 = fVar171 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_3c0;
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar161,local_3c0);
                    auVar143._0_4_ =
                         (uint)(bVar94 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar94 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar143._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar143._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar143._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar143._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar143._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar143._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar92 >> 7,0);
                    auVar143._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar109 = vshufps_avx(auVar143,auVar143,0xb1);
                    auVar109 = vminps_avx(auVar143,auVar109);
                    auVar107 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    auVar107 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    uVar26 = vcmpps_avx512vl(auVar143,auVar109,0);
                    if ((bVar94 & (byte)uVar26) != 0) {
                      uVar93 = (uint)(bVar94 & (byte)uVar26);
                    }
                    uVar87 = 0;
                    for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                      uVar87 = uVar87 + 1;
                    }
                    uVar86 = (ulong)uVar87;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar89->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar230._0_32_);
                      local_640 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_5c0._0_8_ = pGVar89;
                      local_5a0 = local_3c0;
                      local_39c = iVar15;
                      local_390 = auVar96;
                      local_380 = uVar25;
                      uStack_378 = uVar29;
                      local_370 = uVar79;
                      uStack_368 = uVar80;
                      local_360 = uVar81;
                      uStack_358 = uVar82;
                      do {
                        fVar171 = local_340[uVar86];
                        auVar168._4_4_ = fVar171;
                        auVar168._0_4_ = fVar171;
                        auVar168._8_4_ = fVar171;
                        auVar168._12_4_ = fVar171;
                        local_200._16_4_ = fVar171;
                        local_200._0_16_ = auVar168;
                        local_200._20_4_ = fVar171;
                        local_200._24_4_ = fVar171;
                        local_200._28_4_ = fVar171;
                        local_1e0 = *(undefined4 *)(local_320 + uVar86 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar86 * 4);
                        local_670.context = context->user;
                        fVar154 = 1.0 - fVar171;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar154 + fVar154))),
                                                  ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                        auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar168,
                                                   ZEXT416(0xc0a00000));
                        auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                                   ZEXT416((uint)(fVar171 + fVar171)),auVar101);
                        auVar213 = ZEXT1664(auVar102);
                        auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar168,
                                                   ZEXT416(0x40000000));
                        auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154 * -3.0)),
                                                   ZEXT416((uint)(fVar154 + fVar154)),auVar101);
                        auVar156 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar168,
                                                   ZEXT416((uint)(fVar154 * -2.0)));
                        fVar171 = auVar8._0_4_ * 0.5;
                        fVar154 = auVar102._0_4_ * 0.5;
                        fVar166 = auVar101._0_4_ * 0.5;
                        fVar167 = auVar156._0_4_ * 0.5;
                        auVar184._0_4_ = fVar167 * local_6d0;
                        auVar184._4_4_ = fVar167 * fStack_6cc;
                        auVar184._8_4_ = fVar167 * fStack_6c8;
                        auVar184._12_4_ = fVar167 * fStack_6c4;
                        auVar204._4_4_ = fVar166;
                        auVar204._0_4_ = fVar166;
                        auVar204._8_4_ = fVar166;
                        auVar204._12_4_ = fVar166;
                        auVar101 = vfmadd132ps_fma(auVar204,auVar184,auVar11);
                        auVar185._4_4_ = fVar154;
                        auVar185._0_4_ = fVar154;
                        auVar185._8_4_ = fVar154;
                        auVar185._12_4_ = fVar154;
                        auVar101 = vfmadd132ps_fma(auVar185,auVar101,auVar12);
                        auVar157._4_4_ = fVar171;
                        auVar157._0_4_ = fVar171;
                        auVar157._8_4_ = fVar171;
                        auVar157._12_4_ = fVar171;
                        auVar101 = vfmadd213ps_fma(auVar157,auVar96,auVar101);
                        local_260 = auVar101._0_4_;
                        auVar199._8_4_ = 1;
                        auVar199._0_8_ = 0x100000001;
                        auVar199._12_4_ = 1;
                        auVar199._16_4_ = 1;
                        auVar199._20_4_ = 1;
                        auVar199._24_4_ = 1;
                        auVar199._28_4_ = 1;
                        local_240 = vpermps_avx2(auVar199,ZEXT1632(auVar101));
                        auVar201 = ZEXT3264(local_240);
                        auVar205._8_4_ = 2;
                        auVar205._0_8_ = 0x200000002;
                        auVar205._12_4_ = 2;
                        auVar209._16_4_ = 2;
                        auVar209._0_16_ = auVar205;
                        auVar209._20_4_ = 2;
                        auVar209._24_4_ = 2;
                        auVar209._28_4_ = 2;
                        auVar211 = ZEXT3264(auVar209);
                        local_220 = vpermps_avx2(auVar209,ZEXT1632(auVar101));
                        iStack_25c = local_260;
                        iStack_258 = local_260;
                        iStack_254 = local_260;
                        iStack_250 = local_260;
                        iStack_24c = local_260;
                        iStack_248 = local_260;
                        iStack_244 = local_260;
                        uStack_1dc = local_1e0;
                        uStack_1d8 = local_1e0;
                        uStack_1d4 = local_1e0;
                        uStack_1d0 = local_1e0;
                        uStack_1cc = local_1e0;
                        uStack_1c8 = local_1e0;
                        uStack_1c4 = local_1e0;
                        local_1c0 = local_2c0._0_8_;
                        uStack_1b8 = local_2c0._8_8_;
                        uStack_1b0 = local_2c0._16_8_;
                        uStack_1a8 = local_2c0._24_8_;
                        local_1a0 = local_2a0;
                        auVar109 = vpcmpeqd_avx2(local_2a0,local_2a0);
                        local_628[1] = auVar109;
                        *local_628 = auVar109;
                        local_180 = (local_670.context)->instID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = (local_670.context)->instPrimID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_620 = local_2e0;
                        local_670.valid = (int *)local_620;
                        local_670.geometryUserPtr = pGVar89->userPtr;
                        local_670.hit = (RTCHitN *)&local_260;
                        local_670.N = 8;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar89->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar201 = ZEXT1664(local_240._0_16_);
                          auVar211 = ZEXT1664(auVar205);
                          auVar213 = ZEXT1664(auVar102);
                          (*pGVar89->intersectionFilterN)(&local_670);
                          auVar221 = ZEXT3264(local_5a0);
                          pGVar89 = (Geometry *)local_5c0._0_8_;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01a575a7:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar89->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            auVar211 = ZEXT1664(auVar211._0_16_);
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            (*p_Var17)(&local_670);
                            auVar221 = ZEXT3264(local_5a0);
                            pGVar89 = (Geometry *)local_5c0._0_8_;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01a575a7;
                          uVar28 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar74 = *(int *)(local_670.hit + 0xc);
                          iVar75 = *(int *)(local_670.hit + 0x10);
                          iVar76 = *(int *)(local_670.hit + 0x14);
                          iVar77 = *(int *)(local_670.hit + 0x18);
                          iVar78 = *(int *)(local_670.hit + 0x1c);
                          bVar94 = (byte)uVar28;
                          bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar24 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar94 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar74 = *(int *)(local_670.hit + 0x2c);
                          iVar75 = *(int *)(local_670.hit + 0x30);
                          iVar76 = *(int *)(local_670.hit + 0x34);
                          iVar77 = *(int *)(local_670.hit + 0x38);
                          iVar78 = *(int *)(local_670.hit + 0x3c);
                          bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar24 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar74 = *(int *)(local_670.hit + 0x4c);
                          iVar75 = *(int *)(local_670.hit + 0x50);
                          iVar76 = *(int *)(local_670.hit + 0x54);
                          iVar77 = *(int *)(local_670.hit + 0x58);
                          iVar78 = *(int *)(local_670.hit + 0x5c);
                          bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar24 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar74 = *(int *)(local_670.hit + 0x6c);
                          iVar75 = *(int *)(local_670.hit + 0x70);
                          iVar76 = *(int *)(local_670.hit + 0x74);
                          iVar77 = *(int *)(local_670.hit + 0x78);
                          iVar78 = *(int *)(local_670.hit + 0x7c);
                          bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar24 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar74 = *(int *)(local_670.hit + 0x8c);
                          iVar75 = *(int *)(local_670.hit + 0x90);
                          iVar76 = *(int *)(local_670.hit + 0x94);
                          iVar77 = *(int *)(local_670.hit + 0x98);
                          iVar78 = *(int *)(local_670.hit + 0x9c);
                          bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar24 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar94 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar94 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x21c);
                          auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar109;
                          auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar109;
                          auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar109;
                          auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar109;
                          local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        bVar94 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & (byte)uVar92;
                        auVar162._4_4_ = local_640._0_4_;
                        auVar162._0_4_ = local_640._0_4_;
                        auVar162._8_4_ = local_640._0_4_;
                        auVar162._12_4_ = local_640._0_4_;
                        auVar162._16_4_ = local_640._0_4_;
                        auVar162._20_4_ = local_640._0_4_;
                        auVar162._24_4_ = local_640._0_4_;
                        auVar162._28_4_ = local_640._0_4_;
                        uVar26 = vcmpps_avx512vl(auVar221._0_32_,auVar162,2);
                        if ((bVar94 & (byte)uVar26) == 0) goto LAB_01a57644;
                        bVar94 = bVar94 & (byte)uVar26;
                        uVar93 = (uint)bVar94;
                        uVar92 = (ulong)uVar93;
                        auVar163._8_4_ = 0x7f800000;
                        auVar163._0_8_ = 0x7f8000007f800000;
                        auVar163._12_4_ = 0x7f800000;
                        auVar163._16_4_ = 0x7f800000;
                        auVar163._20_4_ = 0x7f800000;
                        auVar163._24_4_ = 0x7f800000;
                        auVar163._28_4_ = 0x7f800000;
                        auVar109 = vblendmps_avx512vl(auVar163,auVar221._0_32_);
                        auVar144._0_4_ =
                             (uint)(bVar94 & 1) * auVar109._0_4_ |
                             (uint)!(bool)(bVar94 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar94 >> 1 & 1);
                        auVar144._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar94 >> 2 & 1);
                        auVar144._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar94 >> 3 & 1);
                        auVar144._12_4_ =
                             (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar94 >> 4 & 1);
                        auVar144._16_4_ =
                             (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar94 >> 5 & 1);
                        auVar144._20_4_ =
                             (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar94 >> 6 & 1);
                        auVar144._24_4_ =
                             (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar144._28_4_ =
                             (uint)(bVar94 >> 7) * auVar109._28_4_ |
                             (uint)!(bool)(bVar94 >> 7) * 0x7f800000;
                        auVar109 = vshufps_avx(auVar144,auVar144,0xb1);
                        auVar109 = vminps_avx(auVar144,auVar109);
                        auVar107 = vshufpd_avx(auVar109,auVar109,5);
                        auVar109 = vminps_avx(auVar109,auVar107);
                        auVar107 = vpermpd_avx2(auVar109,0x4e);
                        auVar109 = vminps_avx(auVar109,auVar107);
                        uVar26 = vcmpps_avx512vl(auVar144,auVar109,0);
                        bVar94 = (byte)uVar26 & bVar94;
                        if (bVar94 != 0) {
                          uVar93 = (uint)bVar94;
                        }
                        uVar87 = 0;
                        for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                          uVar87 = uVar87 + 1;
                        }
                        uVar86 = (ulong)uVar87;
                      } while( true );
                    }
                    fVar171 = local_340[uVar86];
                    uVar155 = *(undefined4 *)(local_320 + uVar86 * 4);
                    fVar154 = 1.0 - fVar171;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar154 + fVar154))),
                                              ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                    auVar156 = ZEXT416((uint)fVar171);
                    auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,
                                               ZEXT416(0xc0a00000));
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                               ZEXT416((uint)(fVar171 + fVar171)),auVar101);
                    auVar213 = ZEXT1664(auVar102);
                    auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,
                                               ZEXT416(0x40000000));
                    auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154 * -3.0)),
                                               ZEXT416((uint)(fVar154 + fVar154)),auVar101);
                    auVar156 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar156,
                                               ZEXT416((uint)(fVar154 * -2.0)));
                    fVar154 = auVar8._0_4_ * 0.5;
                    fVar166 = auVar102._0_4_ * 0.5;
                    auVar201 = ZEXT464((uint)fVar166);
                    fVar167 = auVar101._0_4_ * 0.5;
                    fVar178 = auVar156._0_4_ * 0.5;
                    auVar182._0_4_ = fVar178 * local_6d0;
                    auVar182._4_4_ = fVar178 * fStack_6cc;
                    auVar182._8_4_ = fVar178 * fStack_6c8;
                    auVar182._12_4_ = fVar178 * fStack_6c4;
                    auVar203._4_4_ = fVar167;
                    auVar203._0_4_ = fVar167;
                    auVar203._8_4_ = fVar167;
                    auVar203._12_4_ = fVar167;
                    auVar101 = vfmadd132ps_fma(auVar203,auVar182,auVar9);
                    auVar211 = ZEXT1664(auVar101);
                    auVar183._4_4_ = fVar166;
                    auVar183._0_4_ = fVar166;
                    auVar183._8_4_ = fVar166;
                    auVar183._12_4_ = fVar166;
                    auVar101 = vfmadd132ps_fma(auVar183,auVar101,auVar10);
                    auVar173._4_4_ = fVar154;
                    auVar173._0_4_ = fVar154;
                    auVar173._8_4_ = fVar154;
                    auVar173._12_4_ = fVar154;
                    auVar101 = vfmadd213ps_fma(auVar173,auVar96,auVar101);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar86 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar101._0_4_;
                    uVar16 = vextractps_avx(auVar101,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
                    uVar16 = vextractps_avx(auVar101,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar171;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar155;
                    *(uint *)(ray + k * 4 + 0x220) = uVar14;
                    *(uint *)(ray + k * 4 + 0x240) = uVar13;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a5722d;
      }
    }
    uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar35._4_4_ = uVar155;
    auVar35._0_4_ = uVar155;
    auVar35._8_4_ = uVar155;
    auVar35._12_4_ = uVar155;
    auVar35._16_4_ = uVar155;
    auVar35._20_4_ = uVar155;
    auVar35._24_4_ = uVar155;
    auVar35._28_4_ = uVar155;
    uVar25 = vcmpps_avx512vl(local_80,auVar35,2);
    uVar91 = (ulong)((uint)uVar91 & (uint)uVar25);
  } while( true );
LAB_01a57644:
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar101);
  auVar231 = ZEXT3264(local_560);
  auVar233 = ZEXT3264(local_580);
  auVar109 = vmovdqa64_avx512vl(local_140);
  auVar230 = ZEXT3264(auVar109);
LAB_01a5722d:
  lVar88 = lVar88 + 8;
  goto LAB_01a5694c;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }